

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O1

bool vkt::anon_unknown_0::logAndVerifyImages
               (TestLog *log,DeviceInterface *vk,VkDevice device,
               vector<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>_>_>
               *attachmentResources,vector<bool,_std::allocator<bool>_> *attachmentIsLazy,
               RenderPass *renderPassInfo,
               vector<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
               *renderPassClearValues,
               vector<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
               *imageClearValues,
               vector<vkt::(anonymous_namespace)::SubpassRenderInfo,_std::allocator<vkt::(anonymous_namespace)::SubpassRenderInfo>_>
               *subpassRenderInfo,UVec2 *targetSize,TestConfig *config)

{
  TestLog *pTVar1;
  VkClearDepthStencilValue *pVVar2;
  ostringstream *this;
  float fVar3;
  float fVar4;
  float fVar5;
  char cVar6;
  VkAttachmentLoadOp VVar7;
  undefined4 uVar8;
  VkFormat format_00;
  pointer pPVar9;
  VkClearValue *value;
  DepthStencilClear *pDVar10;
  RenderQuad *pRVar11;
  float *pfVar12;
  pointer pSVar13;
  void *pvVar14;
  undefined1 auVar15 [8];
  pointer pvVar16;
  pointer pvVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  PixelValue PVar21;
  int i;
  int iVar22;
  int iVar23;
  int iVar24;
  VkResult VVar25;
  pointer pSVar26;
  TextureFormat TVar27;
  ulong uVar28;
  pointer pSVar29;
  pointer pAVar30;
  TextureFormat TVar31;
  pointer pAVar32;
  long *plVar33;
  TextureFormat *pTVar34;
  undefined8 *puVar35;
  pointer pPVar36;
  long *plVar37;
  size_type *psVar38;
  ConstPixelBufferAccess *pCVar39;
  ConstPixelBufferAccess *pCVar40;
  ushort uVar41;
  uint uVar42;
  ulong uVar43;
  pointer pPVar44;
  pointer pSVar45;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  byte bVar46;
  long lVar47;
  ulong uVar48;
  _Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
  *p_Var49;
  long lVar50;
  ushort uVar51;
  uint uVar52;
  undefined1 *puVar53;
  TextureLevel *this_00;
  char *pcVar54;
  ushort uVar55;
  DepthStencilClear *dsClear;
  pointer pCVar56;
  vector<bool,_std::allocator<bool>_> *pvVar57;
  uint uVar58;
  PixelValue *__cur_1;
  ulong uVar59;
  pointer pPVar60;
  pointer pPVar61;
  RenderPass *pRVar62;
  ulong uVar63;
  uint uVar64;
  bool bVar65;
  uint uVar66;
  float fVar67;
  TextureFormat format;
  TextureLevel stencilErrorImage;
  vector<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
  referenceValues;
  TextureFormat format_1;
  size_t index;
  TextureFormat format_7;
  UVec2 size;
  UVec2 offset;
  TextureFormat format_3;
  vector<bool,_std::allocator<bool>_> attachmentUsed;
  vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> referenceAttachments;
  TextureFormat stencilFormat;
  TextureFormat depthFormat;
  pointer local_510;
  string local_508;
  int local_4e4;
  long *local_4e0;
  long local_4d8;
  long local_4d0;
  long lStack_4c8;
  undefined1 local_4c0 [8];
  TextureFormat TStack_4b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b0;
  pointer local_498;
  RenderPass *local_490;
  int local_484;
  int local_480;
  int local_47c;
  TestLog *local_478;
  ConstPixelBufferAccess local_470;
  string local_448;
  ulong local_428;
  uint local_41c;
  string local_418;
  vector<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
  local_3f8;
  UVec2 *local_3d8;
  UVec2 *local_3d0;
  undefined1 local_3c8 [8];
  undefined8 uStack_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  _Alloc_hider local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398 [6];
  pointer local_338;
  pointer local_330;
  pointer local_328;
  TextureFormat local_320;
  int local_314;
  undefined1 local_310 [40];
  undefined1 local_2e8 [8];
  anon_union_8_2_d0736028_for_Maybe<bool>_2 local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  ulong local_2c8;
  undefined4 local_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  ulong local_2a0;
  ConstPixelBufferAccess local_298;
  vector<bool,_std::allocator<bool>_> *local_270;
  ulong local_268;
  void *local_260;
  long *local_258;
  long local_250;
  long local_248;
  long lStack_240;
  pointer local_238;
  vector<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>_>_>
  *local_230;
  pointer local_228;
  uint local_21c;
  long *local_218 [2];
  long local_208 [2];
  undefined1 local_1f8 [24];
  uint local_1e0;
  _Bit_pointer local_1d8;
  ios_base local_188 [8];
  ios_base local_180 [264];
  vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> local_78;
  DeviceInterface *local_58;
  VkDevice local_50;
  TextureFormat local_48;
  TextureFormat local_40;
  ulong local_38;
  
  local_3f8.
  super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3f8.
  super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3f8.
  super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this = (ostringstream *)(local_1f8 + 8);
  local_478 = log;
  local_230 = attachmentResources;
  local_1f8._0_8_ = log;
  local_58 = vk;
  local_50 = device;
  std::__cxx11::ostringstream::ostringstream(this);
  local_270 = attachmentIsLazy;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this,"Reference images fill undefined pixels with 3x3 grid pattern.",0x3d);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this);
  std::ios_base::~ios_base(local_180);
  local_3c8 = (undefined1  [8])((ulong)local_3c8 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_1f8,
             (long)(renderPassInfo->m_attachments).
                   super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(renderPassInfo->m_attachments).
                   super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,(bool *)local_3c8,
             (allocator_type *)local_2e8);
  pvVar17 = local_3f8.
            super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pvVar16 = local_3f8.
            super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_490 = renderPassInfo;
  uVar59 = (long)(renderPassInfo->m_attachments).
                 super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(renderPassInfo->m_attachments).
                 super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5;
  lVar47 = (long)local_3f8.
                 super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_3f8.
                 super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3;
  uVar48 = lVar47 * -0x5555555555555555;
  uVar63 = uVar59 + lVar47 * 0x5555555555555555;
  if (uVar59 < uVar48 || uVar63 == 0) {
    if ((uVar59 < uVar48) &&
       (pSVar26 = (pointer)(&(local_3f8.
                              super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                           + uVar59), pSVar45 = pSVar26,
       (pointer)local_3f8.
                super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish != pSVar26)) {
      do {
        pPVar61 = (((_Vector_impl *)&pSVar45->m_viewportOffset)->super__Vector_impl_data)._M_start;
        if (pPVar61 != (pointer)0x0) {
          operator_delete(pPVar61,(long)(((_Vector_impl *)&pSVar45->m_viewportOffset)->
                                        super__Vector_impl_data)._M_end_of_storage - (long)pPVar61);
        }
        pSVar45 = (pointer)&pSVar45->m_flags;
      } while (pSVar45 != (pointer)pvVar17);
      local_3f8.
      super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)pSVar26;
    }
  }
  else if ((ulong)(((long)local_3f8.
                          super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3f8.
                          super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish >> 3) * -0x5555555555555555) <
           uVar63) {
    if (lVar47 * 0x5555555555555555 + 0x555555555555555U < uVar63) {
      std::__throw_length_error("vector::_M_default_append");
    }
    local_498 = (pointer)local_3f8.
                         super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    uVar28 = uVar63;
    if (uVar63 <= uVar48 && uVar48 - uVar63 != 0) {
      uVar28 = uVar48;
    }
    uVar43 = uVar28 + uVar48;
    if (0x555555555555554 < uVar43) {
      uVar43 = 0x555555555555555;
    }
    if (CARRY8(uVar28,uVar48)) {
      uVar43 = 0x555555555555555;
    }
    if (uVar43 == 0) {
      pSVar26 = (pointer)0x0;
    }
    else {
      pSVar26 = (pointer)operator_new(uVar43 * 0x18);
    }
    memset(&(((_Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
               *)&pSVar26->m_viewportOffset)->_M_impl).super__Vector_impl_data._M_start + lVar47,0,
           uVar63 * 0x18);
    if (pvVar16 != pvVar17) {
      lVar47 = 0;
      do {
        puVar35 = (undefined8 *)
                  ((long)&(pvVar16->
                          super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar47);
        *(undefined8 *)
         ((long)&(((_Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                    *)&pSVar26->m_viewportOffset)->_M_impl).super__Vector_impl_data._M_start +
         lVar47) = *puVar35;
        *(undefined8 *)
         ((long)&(((_Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                    *)&pSVar26->m_viewportOffset)->_M_impl).super__Vector_impl_data._M_finish +
         lVar47) = puVar35[1];
        *(undefined8 *)
         ((long)&(((_Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                    *)&pSVar26->m_viewportOffset)->_M_impl).super__Vector_impl_data.
                 _M_end_of_storage + lVar47) = puVar35[2];
        *puVar35 = 0;
        puVar35[1] = 0;
        puVar35[2] = 0;
        lVar47 = lVar47 + 0x18;
      } while ((pointer)(puVar35 + 3) != (pointer)pvVar17);
    }
    if ((pointer)pvVar16 != (pointer)0x0) {
      operator_delete(pvVar16,(long)local_498 - (long)pvVar16);
    }
    local_3f8.
    super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pSVar26;
    local_3f8.
    super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((_Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                    *)&pSVar26->m_viewportOffset + uVar59);
    local_3f8.
    super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((_Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                    *)&pSVar26->m_viewportOffset + uVar43);
  }
  else {
    memset(local_3f8.
           super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish,0,uVar63 * 0x18);
    local_3f8.
    super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)pvVar17 + uVar63 * 0x18);
  }
  pAVar32 = (local_490->m_attachments).
            super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pRVar62 = local_490;
  if ((local_490->m_attachments).
      super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
      ._M_impl.super__Vector_impl_data._M_finish != pAVar32) {
    uVar48 = 0;
    do {
      TVar27 = ::vk::mapVkFormat(pAVar32[uVar48].m_format);
      local_4c0._0_4_ = TVar27.order;
      local_4c0._4_4_ = TVar27.type;
      pSVar45 = (pointer)(uVar48 * 3);
      uVar63 = (ulong)(targetSize->m_data[1] * targetSize->m_data[0]);
      pSVar26 = (pointer)(&(local_3f8.
                            super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                         + uVar48);
      pPVar61 = (((_Vector_impl *)&pSVar26->m_viewportOffset)->super__Vector_impl_data)._M_start;
      pPVar60 = (((_Vector_impl *)&pSVar26->m_viewportOffset)->super__Vector_impl_data)._M_finish;
      uVar59 = (long)pPVar60 - (long)pPVar61 >> 1;
      lVar47 = uVar59 - uVar63;
      if (uVar63 <= uVar59) {
        if ((uVar63 <= uVar59 && lVar47 != 0) && (pPVar61 = pPVar61 + uVar63, pPVar60 != pPVar61)) {
          (((_Vector_impl *)&pSVar26->m_viewportOffset)->super__Vector_impl_data)._M_finish =
               pPVar61;
        }
      }
      else {
        uVar28 = uVar63 - uVar59;
        if (uVar28 != 0) {
          local_498 = pSVar26;
          local_330 = pSVar45;
          if ((ulong)((long)(((_Vector_impl *)&pSVar26->m_viewportOffset)->super__Vector_impl_data).
                            _M_end_of_storage - (long)pPVar60 >> 1) < uVar28) {
            if ((uVar59 ^ 0x3fffffffffffffff) < uVar28) {
              std::__throw_length_error("vector::_M_default_append");
            }
            if (uVar28 < uVar59) {
              uVar28 = uVar59;
            }
            local_260 = (void *)(uVar28 + uVar59);
            if ((void *)0x3ffffffffffffffe < local_260) {
              local_260 = (void *)0x3fffffffffffffff;
            }
            if (CARRY8(uVar28,uVar59)) {
              local_260 = (void *)0x3fffffffffffffff;
            }
            if (local_260 == (void *)0x0) {
              local_238 = (pointer)0x0;
            }
            else {
              local_238 = (pointer)operator_new((long)local_260 * 2);
            }
            pPVar61 = local_238 + uVar59;
            lVar47 = uVar59 - uVar63;
            local_428 = uVar63;
            do {
              local_3c8._0_4_ = 0.0;
              local_3c8._4_4_ = 0;
              local_2e8._0_4_ = R;
              local_2e8._4_4_ = SNORM_INT8;
              local_310._0_4_ = R;
              local_310._4_4_ = SNORM_INT8;
              local_298.m_format.order = R;
              local_298.m_format.type = SNORM_INT8;
              PixelValue::PixelValue
                        (pPVar61,(Maybe<bool> *)local_3c8,(Maybe<bool> *)local_2e8,
                         (Maybe<bool> *)local_310,(Maybe<bool> *)&local_298);
              pPVar60 = local_238;
              pvVar14 = local_260;
              pSVar45 = local_330;
              pPVar61 = pPVar61 + 1;
              lVar47 = lVar47 + 1;
            } while (lVar47 != 0);
            pPVar9 = (((_Vector_impl *)&local_498->m_viewportOffset)->super__Vector_impl_data).
                     _M_finish;
            pPVar61 = (((_Vector_impl *)&local_498->m_viewportOffset)->super__Vector_impl_data).
                      _M_start;
            pPVar36 = local_238;
            for (pPVar44 = pPVar61; pPVar44 != pPVar9; pPVar44 = pPVar44 + 1) {
              pPVar36->m_status = pPVar44->m_status;
              pPVar36 = pPVar36 + 1;
            }
            if (pPVar61 != (pointer)0x0) {
              operator_delete(pPVar61,(long)(((_Vector_impl *)&local_498->m_viewportOffset)->
                                            super__Vector_impl_data)._M_end_of_storage -
                                      (long)pPVar61);
            }
            (((_Vector_impl *)&local_498->m_viewportOffset)->super__Vector_impl_data)._M_start =
                 pPVar60;
            (((_Vector_impl *)&local_498->m_viewportOffset)->super__Vector_impl_data)._M_finish =
                 pPVar60 + local_428;
            (((_Vector_impl *)&local_498->m_viewportOffset)->super__Vector_impl_data).
            _M_end_of_storage = pPVar60 + (long)pvVar14;
            pSVar26 = local_498;
          }
          else {
            do {
              local_3c8._0_4_ = 0.0;
              local_3c8._4_4_ = 0;
              local_2e8._0_4_ = R;
              local_2e8._4_4_ = SNORM_INT8;
              local_310._0_4_ = R;
              local_310._4_4_ = SNORM_INT8;
              local_298.m_format.order = R;
              local_298.m_format.type = SNORM_INT8;
              PixelValue::PixelValue
                        (pPVar60,(Maybe<bool> *)local_3c8,(Maybe<bool> *)local_2e8,
                         (Maybe<bool> *)local_310,(Maybe<bool> *)&local_298);
              pPVar60 = pPVar60 + 1;
              lVar47 = lVar47 + 1;
            } while (lVar47 != 0);
            (((_Vector_impl *)&local_498->m_viewportOffset)->super__Vector_impl_data)._M_finish =
                 pPVar60;
            pSVar26 = local_498;
            pSVar45 = local_330;
          }
        }
      }
      pRVar62 = local_490;
      value = (&((imageClearValues->
                 super__Vector_base<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
                 )._M_impl.super__Vector_impl_data._M_start)->m_ptr)[(long)pSVar45];
      if (value != (VkClearValue *)0x0) {
        local_3c8._0_4_ = 0.0;
        local_3c8._4_4_ = 0;
        local_2e8._0_4_ = 0x1010101;
        PVar21 = clearValueToPixelValue(value,(TextureFormat *)local_4c0);
        local_310._0_2_ = PVar21.m_status;
        clearReferenceValues
                  ((vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                    *)pSVar26,targetSize,(UVec2 *)local_3c8,targetSize,(BVec4 *)local_2e8,
                   (PixelValue *)local_310);
      }
      uVar48 = uVar48 + 1;
      pAVar32 = (pRVar62->m_attachments).
                super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar48 < (ulong)((long)(pRVar62->m_attachments).
                                    super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar32 >> 5)
            );
  }
  pSVar26 = (pointer)&config->renderPos;
  local_3d8 = (UVec2 *)pSVar26;
  local_3d0 = &config->renderSize;
  pSVar29 = (pRVar62->m_subpasses).
            super__Vector_base<vkt::(anonymous_namespace)::Subpass,_std::allocator<vkt::(anonymous_namespace)::Subpass>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((pRVar62->m_subpasses).
      super__Vector_base<vkt::(anonymous_namespace)::Subpass,_std::allocator<vkt::(anonymous_namespace)::Subpass>_>
      ._M_impl.super__Vector_impl_data._M_finish != pSVar29) {
    pSVar45 = (pointer)0x0;
    do {
      pvVar16 = local_3f8.
                super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_328 = pSVar45;
      local_498 = (subpassRenderInfo->
                  super__Vector_base<vkt::(anonymous_namespace)::SubpassRenderInfo,_std::allocator<vkt::(anonymous_namespace)::SubpassRenderInfo>_>
                  )._M_impl.super__Vector_impl_data._M_start + (long)pSVar45;
      pAVar30 = pSVar29[(long)pSVar45].m_colorAttachments.
                super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_338 = pSVar29 + (long)pSVar45;
      if (pSVar29[(long)pSVar45].m_colorAttachments.
          super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
          ._M_impl.super__Vector_impl_data._M_finish != pAVar30) {
        uVar48 = 0;
        do {
          uVar66 = pAVar30[uVar48].m_attachment;
          uVar59 = (ulong)uVar66;
          if (((ulong)((TestLog *)(local_1f8._0_8_ + (ulong)(uVar66 >> 6) * 8))->m_log >>
               (uVar59 & 0x3f) & 1) == 0) {
            pAVar32 = (local_490->m_attachments).
                      super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_3c8 = (undefined1  [8])::vk::mapVkFormat(pAVar32[uVar59].m_format);
            VVar7 = pAVar32[uVar59].m_loadOp;
            if (VVar7 == VK_ATTACHMENT_LOAD_OP_DONT_CARE) {
              local_2e8._0_4_ = 0x1010101;
              markUndefined((vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                             *)(&pvVar16->
                                 super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                               + uVar59),(BVec4 *)local_2e8,targetSize,local_3d8,local_3d0);
            }
            else if (VVar7 == VK_ATTACHMENT_LOAD_OP_CLEAR) {
              local_2e8._0_4_ = 0x1010101;
              PVar21 = clearValueToPixelValue
                                 ((renderPassClearValues->
                                  super__Vector_base<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start[uVar59].m_ptr,
                                  (TextureFormat *)local_3c8);
              local_310._0_2_ = PVar21.m_status;
              clearReferenceValues
                        ((vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                          *)(&pvVar16->
                              super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                            + uVar59),targetSize,local_3d8,local_3d0,(BVec4 *)local_2e8,
                         (PixelValue *)local_310);
            }
            pTVar1 = (TestLog *)(local_1f8._0_8_ + (ulong)(uVar66 >> 6) * 8);
            pTVar1->m_log = (qpTestLog *)((ulong)pTVar1->m_log | 1L << ((byte)uVar66 & 0x3f));
          }
          uVar48 = uVar48 + 1;
          pAVar30 = (local_338->m_colorAttachments).
                    super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar48 < (ulong)((long)(local_338->m_colorAttachments).
                                        super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar30
                                 >> 3));
      }
      pSVar26 = local_498;
      uVar66 = (local_338->m_depthStencilAttachment).m_attachment;
      uVar48 = (ulong)uVar66;
      if (uVar48 != 0xffffffff) {
        if (((ulong)((TestLog *)(local_1f8._0_8_ + (ulong)(uVar66 >> 6) * 8))->m_log >>
             (uVar48 & 0x3f) & 1) == 0) {
          pAVar32 = (local_490->m_attachments).
                    super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          p_Var49 = &(local_3f8.
                      super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                     super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                    + uVar48;
          local_3c8 = (undefined1  [8])::vk::mapVkFormat(pAVar32[uVar48].m_format);
          bVar18 = tcu::hasDepthComponent((ChannelOrder)local_3c8._0_4_);
          if (bVar18) {
            if (pAVar32[uVar48].m_loadOp == VK_ATTACHMENT_LOAD_OP_DONT_CARE) {
              local_2e8._0_4_ = A;
              markUndefined((vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                             *)p_Var49,(BVec4 *)local_2e8,targetSize,local_3d8,local_3d0);
            }
            else if (pAVar32[uVar48].m_loadOp == VK_ATTACHMENT_LOAD_OP_CLEAR) {
              local_2e8._0_4_ = A;
              PVar21 = clearValueToPixelValue
                                 ((renderPassClearValues->
                                  super__Vector_base<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start[uVar48].m_ptr,
                                  (TextureFormat *)local_3c8);
              local_310._0_2_ = PVar21.m_status;
              clearReferenceValues
                        ((vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                          *)p_Var49,targetSize,local_3d8,local_3d0,(BVec4 *)local_2e8,
                         (PixelValue *)local_310);
            }
          }
          bVar18 = tcu::hasStencilComponent(local_3c8._0_4_);
          if (bVar18) {
            if (pAVar32[uVar48].m_stencilLoadOp == VK_ATTACHMENT_LOAD_OP_DONT_CARE) {
              local_2e8._0_4_ = 0x100;
              markUndefined((vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                             *)p_Var49,(BVec4 *)local_2e8,targetSize,local_3d8,local_3d0);
            }
            else if (pAVar32[uVar48].m_stencilLoadOp == VK_ATTACHMENT_LOAD_OP_CLEAR) {
              local_2e8._0_4_ = 0x100;
              PVar21 = clearValueToPixelValue
                                 ((renderPassClearValues->
                                  super__Vector_base<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start[uVar48].m_ptr,
                                  (TextureFormat *)local_3c8);
              local_310._0_2_ = PVar21.m_status;
              clearReferenceValues
                        ((vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                          *)p_Var49,targetSize,local_3d8,local_3d0,(BVec4 *)local_2e8,
                         (PixelValue *)local_310);
            }
          }
          pTVar1 = (TestLog *)(local_1f8._0_8_ + (ulong)(uVar66 >> 6) * 8);
          pTVar1->m_log = (qpTestLog *)((ulong)pTVar1->m_log | 1L << ((byte)uVar66 & 0x3f));
        }
      }
      pvVar16 = local_3f8.
                super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pCVar56 = *(pointer *)
                 &(pSVar26->m_colorClears).
                  super__Vector_base<vkt::(anonymous_namespace)::ColorClear,_std::allocator<vkt::(anonymous_namespace)::ColorClear>_>
                  ._M_impl;
      if ((pSVar26->m_colorClears).
          super__Vector_base<vkt::(anonymous_namespace)::ColorClear,_std::allocator<vkt::(anonymous_namespace)::ColorClear>_>
          ._M_impl.super__Vector_impl_data._M_finish != pCVar56) {
        lVar47 = 0x10;
        uVar48 = 0;
        do {
          local_2e8 = *(undefined1 (*) [8])((long)(&pCVar56->m_offset + -2) + lVar47);
          local_310._0_8_ = *(TextureFormat *)((long)(&pCVar56->m_offset + -1) + lVar47);
          uVar66 = (local_338->m_colorAttachments).
                   super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar48].m_attachment;
          local_298.m_format =
               ::vk::mapVkFormat((local_490->m_attachments).
                                 super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar66].m_format);
          pVVar2 = (VkClearDepthStencilValue *)((long)(pCVar56->m_offset).m_data + lVar47);
          local_3c8 = *(undefined1 (*) [8])pVVar2;
          uStack_3c0 = *(anon_union_8_2_d0736028_for_Maybe<bool>_2 *)(pVVar2 + 1);
          local_4c0._0_4_ = 0x1010101;
          local_470.m_format.order._0_2_ =
               clearValueToPixelValue((VkClearValue *)local_3c8,&local_298.m_format);
          clearReferenceValues
                    ((vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                      *)(&pvVar16->
                          super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                        + uVar66),targetSize,(UVec2 *)local_2e8,(UVec2 *)local_310,
                     (BVec4 *)local_4c0,(PixelValue *)&local_470);
          uVar48 = uVar48 + 1;
          pCVar56 = *(pointer *)
                     &(pSVar26->m_colorClears).
                      super__Vector_base<vkt::(anonymous_namespace)::ColorClear,_std::allocator<vkt::(anonymous_namespace)::ColorClear>_>
                      ._M_impl;
          lVar47 = lVar47 + 0x20;
        } while (uVar48 < (ulong)((long)(pSVar26->m_colorClears).
                                        super__Vector_base<vkt::(anonymous_namespace)::ColorClear,_std::allocator<vkt::(anonymous_namespace)::ColorClear>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar56
                                 >> 5));
      }
      pDVar10 = (pSVar26->m_depthStencilClear).m_ptr;
      if (pDVar10 != (DepthStencilClear *)0x0) {
        local_2e8 = *(undefined1 (*) [8])(pDVar10->m_offset).m_data;
        local_310._0_8_ = *(undefined8 *)(pDVar10->m_size).m_data;
        uVar66 = (local_338->m_depthStencilAttachment).m_attachment;
        local_298.m_format =
             ::vk::mapVkFormat((local_490->m_attachments).
                               super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar66].m_format);
        bVar18 = tcu::hasStencilComponent(local_298.m_format.order);
        bVar19 = tcu::hasDepthComponent(local_298.m_format.order);
        pvVar16 = local_3f8.
                  super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        auVar15 = local_4c0;
        local_3c8._0_4_ = pDVar10->m_depth;
        local_3c8._4_4_ = pDVar10->m_stencil;
        local_4c0[1] = bVar18;
        local_4c0[0] = bVar19;
        local_4c0._4_4_ = auVar15._4_4_;
        local_4c0._2_2_ = 0;
        local_470.m_format.order._0_2_ =
             clearValueToPixelValue((VkClearValue *)local_3c8,&local_298.m_format);
        clearReferenceValues
                  ((vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                    *)(&pvVar16->
                        super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                      + uVar66),targetSize,(UVec2 *)local_2e8,(UVec2 *)local_310,(BVec4 *)local_4c0,
                   (PixelValue *)&local_470);
      }
      pSVar29 = local_338;
      pRVar62 = local_490;
      pRVar11 = (pSVar26->m_renderQuad).m_ptr;
      if (pRVar11 != (RenderQuad *)0x0) {
        pfVar12 = *(float **)
                   &(pRVar11->m_vertices).
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
        ;
        fVar67 = *pfVar12;
        fVar3 = pfVar12[1];
        fVar4 = pfVar12[4];
        fVar5 = pfVar12[5];
        local_3c8._4_4_ =
             (float)*(uint *)((long)&(((_Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                        *)&pSVar26->m_viewportOffset)->_M_impl).
                                     super__Vector_impl_data._M_start + 4);
        local_3c8._0_4_ =
             (float)*(uint *)&(((_Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                 *)&pSVar26->m_viewportOffset)->_M_impl).super__Vector_impl_data.
                              _M_start;
        local_298.m_format.order =
             (ChannelOrder)
             (float)*(uint *)&(((_Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                 *)&pSVar26->m_viewportOffset)->_M_impl).super__Vector_impl_data.
                              _M_finish;
        local_298.m_format.type =
             (ChannelType)
             (float)*(uint *)((long)&(((_Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                        *)&pSVar26->m_viewportOffset)->_M_impl).
                                     super__Vector_impl_data._M_finish + 4);
        lVar47 = 0;
        do {
          *(undefined4 *)(local_4c0 + lVar47 * 4) = 0x40000000;
          lVar47 = lVar47 + 1;
        } while (lVar47 == 1);
        local_2e8._0_4_ = R;
        local_2e8._4_4_ = SNORM_INT8;
        lVar47 = 0;
        do {
          *(float *)(local_2e8 + lVar47 * 4) =
               (float)local_298.m_size.m_data[lVar47 + -2] / *(float *)(local_4c0 + lVar47 * 4);
          lVar47 = lVar47 + 1;
        } while (lVar47 == 1);
        local_310._0_4_ = R;
        local_310._4_4_ = SNORM_INT8;
        lVar47 = 0;
        do {
          *(float *)(local_310 + lVar47 * 4) =
               *(float *)(local_3c8 + lVar47 * 4) + *(float *)(local_2e8 + lVar47 * 4);
          lVar47 = lVar47 + 1;
        } while (lVar47 == 1);
        local_3c8._4_4_ = local_298.m_format.type;
        local_3c8._0_4_ = local_298.m_format.order;
        lVar47 = 0;
        do {
          *(undefined4 *)(local_2e8 + lVar47 * 4) = 0x40000000;
          lVar47 = lVar47 + 1;
        } while (lVar47 == 1);
        local_298.m_format.order = R;
        local_298.m_format.type = SNORM_INT8;
        lVar47 = 0;
        do {
          local_298.m_size.m_data[lVar47 + -2] =
               (int)(*(float *)(local_3c8 + lVar47 * 4) / *(float *)(local_2e8 + lVar47 * 4));
          lVar47 = lVar47 + 1;
        } while (lVar47 == 1);
        fVar67 = fVar67 * (float)local_298.m_format.order + (float)local_310._0_4_;
        uVar66 = -(uint)(fVar67 < 0.0);
        local_480 = (int)((float)(~uVar66 & 0x3f000000 | uVar66 & 0xbf000000) + fVar67);
        fVar67 = fVar3 * (float)local_298.m_format.type + (float)local_310._4_4_;
        uVar66 = -(uint)(fVar67 < 0.0);
        local_4e4 = (int)((float)(~uVar66 & 0x3f000000 | uVar66 & 0xbf000000) + fVar67);
        fVar67 = fVar4 * (float)local_298.m_format.order + (float)local_310._0_4_;
        uVar66 = -(uint)(fVar67 < 0.0);
        local_47c = (int)((float)(~uVar66 & 0x3f000000 | uVar66 & 0xbf000000) + fVar67);
        fVar67 = fVar5 * (float)local_298.m_format.type + (float)local_310._4_4_;
        uVar66 = -(uint)(fVar67 < 0.0);
        local_484 = (int)((float)(~uVar66 & 0x3f000000 | uVar66 & 0xbf000000) + fVar67);
        if ((local_338->m_inputAttachments).
            super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            (local_338->m_inputAttachments).
            super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pAVar30 = (local_338->m_colorAttachments).
                    super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((local_338->m_colorAttachments).
              super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
              ._M_impl.super__Vector_impl_data._M_finish != pAVar30) {
            local_498 = (pointer)local_3f8.
                                 super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
            uVar48 = 0;
            do {
              uVar59 = (ulong)pAVar30[uVar48].m_attachment;
              local_3c8 = (undefined1  [8])
                          ::vk::mapVkFormat((pRVar62->m_attachments).
                                            super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar59].
                                            m_format);
              tcu::getTextureFormatChannelMask((tcu *)local_2e8,(TextureFormat *)local_3c8);
              if (local_4e4 < local_484) {
                iVar22 = local_4e4;
                do {
                  if (local_480 < local_47c) {
                    uVar66 = iVar22 % 2;
                    iVar24 = local_480;
                    do {
                      uVar58 = iVar24 % 2;
                      uVar28 = (ulong)(targetSize->m_data[0] * iVar22 + iVar24);
                      pcVar54 = local_2e8;
                      lVar47 = 0;
                      uVar63 = (long)&(((_Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                         *)&local_328->m_viewportOffset)->_M_impl).
                                      super__Vector_impl_data._M_start + uVar59;
                      do {
                        if (*pcVar54 == '\x01') {
                          if (*(uint *)(&DAT_00af1aa0 + (ulong)((uint)uVar63 & 3) * 4) < 4) {
                            uVar64 = (uint)(uVar63 >> 1) & 1;
                            uVar42 = (uint)uVar63 & 1;
                            switch(*(uint *)(&DAT_00af1aa0 + (ulong)((uint)uVar63 & 3) * 4)) {
                            case 0:
                              bVar18 = uVar64 == uVar66 && uVar42 == uVar58;
                              break;
                            case 1:
                              bVar18 = uVar66 == uVar64 || uVar58 == uVar42;
                              break;
                            case 2:
                              bVar18 = (uVar66 == uVar64) == (uVar58 == uVar42);
                              break;
                            case 3:
                              bVar18 = (uVar66 == uVar64) != (uVar58 == uVar42);
                            }
                          }
                          else {
                            bVar18 = false;
                          }
                          lVar50 = *(long *)&((_Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                               *)&local_498->m_viewportOffset)[uVar59]._M_impl;
                          uVar55 = (ushort)(1 << ((byte)lVar47 & 0x1f)) |
                                   *(ushort *)(lVar50 + uVar28 * 2);
                          uVar51 = (ushort)(2 << ((byte)lVar47 & 0x1f));
                          uVar41 = uVar51 | uVar55;
                          if (!bVar18) {
                            uVar41 = ~uVar51 & uVar55;
                          }
                          *(ushort *)(lVar50 + uVar28 * 2) = uVar41;
                          pRVar62 = local_490;
                        }
                        lVar47 = lVar47 + 2;
                        uVar63 = uVar63 + 1;
                        pcVar54 = pcVar54 + 1;
                      } while (lVar47 != 8);
                      iVar24 = iVar24 + 1;
                    } while (iVar24 != local_47c);
                  }
                  iVar22 = iVar22 + 1;
                } while (iVar22 != local_484);
              }
              uVar48 = uVar48 + 1;
              pAVar30 = (local_338->m_colorAttachments).
                        super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            } while (uVar48 < (ulong)((long)(local_338->m_colorAttachments).
                                            super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pAVar30 >> 3));
          }
          uVar48 = (ulong)(local_338->m_depthStencilAttachment).m_attachment;
          if ((uVar48 != 0xffffffff) &&
             (TVar27 = ::vk::mapVkFormat((local_490->m_attachments).
                                         super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar48].m_format)
             , local_4e4 < local_484)) {
            p_Var49 = &(local_3f8.
                        super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
            ;
            puVar53 = (undefined1 *)
                      ((long)&(((_Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                 *)&local_328->m_viewportOffset)->_M_impl).super__Vector_impl_data.
                              _M_start + 1);
            uVar66 = (uint)puVar53;
            local_510._0_4_ = uVar66 & 1;
            uVar58 = (uint)((ulong)puVar53 >> 1) & 1;
            do {
              if (local_480 < local_47c) {
                uVar64 = local_4e4 % 2;
                iVar22 = local_480;
                do {
                  bVar18 = tcu::hasDepthComponent(TVar27.order);
                  if (bVar18) {
                    if (*(uint *)(&DAT_00af1aa0 + (ulong)(uVar66 & 3) * 4) < 4) {
                      uVar42 = iVar22 % 2;
                      switch(*(uint *)(&DAT_00af1aa0 + (ulong)(uVar66 & 3) * 4)) {
                      case 0:
                        bVar18 = uVar64 == uVar58 && uVar42 == (uint)local_510;
                        break;
                      case 1:
                        bVar18 = uVar64 == uVar58 || uVar42 == (uint)local_510;
                        break;
                      case 2:
                        bVar18 = (uVar64 == uVar58) == (uVar42 == (uint)local_510);
                        break;
                      case 3:
                        bVar18 = (uVar64 == uVar58) != (uVar42 == (uint)local_510);
                      }
                    }
                    else {
                      bVar18 = false;
                    }
                    uVar59 = (ulong)(targetSize->m_data[0] * local_4e4 + iVar22);
                    lVar47 = *(long *)&p_Var49[uVar48]._M_impl;
                    uVar41 = *(ushort *)(lVar47 + uVar59 * 2);
                    uVar51 = uVar41 | 3;
                    if (!bVar18) {
                      uVar51 = (uVar41 & 0xfffc) + 1;
                    }
                    *(ushort *)(lVar47 + uVar59 * 2) = uVar51;
                  }
                  bVar18 = tcu::hasStencilComponent(TVar27.order);
                  if (bVar18) {
                    uVar59 = (ulong)(targetSize->m_data[0] * local_4e4 + iVar22);
                    lVar47 = *(long *)&p_Var49[uVar48]._M_impl;
                    uVar41 = *(ushort *)(lVar47 + uVar59 * 2);
                    uVar51 = uVar41 | 0xc;
                    if (((ulong)local_328 & 1) != 0) {
                      uVar51 = uVar41 & 0xfff3 | 4;
                    }
                    *(ushort *)(lVar47 + uVar59 * 2) = uVar51;
                  }
                  iVar22 = iVar22 + 1;
                } while (local_47c != iVar22);
              }
              local_4e4 = local_4e4 + 1;
            } while (local_4e4 != local_484);
          }
        }
        else {
          local_3c8._0_4_ = 0.0;
          local_3c8._4_4_ = 0;
          uStack_3c0._0_4_ = R;
          uStack_3c0._4_4_ = SNORM_INT8;
          local_3b8._M_allocated_capacity = 0;
          pAVar30 = (local_338->m_colorAttachments).
                    super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((local_338->m_colorAttachments).
              super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
              ._M_impl.super__Vector_impl_data._M_finish == pAVar30) {
            local_268 = 0;
          }
          else {
            local_268 = 0;
            uVar48 = 0;
            do {
              TVar27 = ::vk::mapVkFormat((pRVar62->m_attachments).
                                         super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                                         ._M_impl.super__Vector_impl_data._M_start
                                         [pAVar30[uVar48].m_attachment].m_format);
              iVar22 = tcu::getNumUsedChannels(TVar27.order);
              local_268 = local_268 + (long)iVar22;
              uVar48 = uVar48 + 1;
              pAVar30 = (pSVar29->m_colorAttachments).
                        super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            } while (uVar48 < (ulong)((long)(pSVar29->m_colorAttachments).
                                            super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pAVar30 >> 3));
          }
          if (local_4e4 < local_484) {
            local_268 = local_268 + ((pSVar29->m_depthStencilAttachment).m_attachment != 0xffffffff)
            ;
            local_228 = (pointer)local_3f8.
                                 super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
            iVar22 = local_4e4;
            do {
              if (local_480 < local_47c) {
                local_41c = iVar22 % 2;
                local_314 = iVar22;
                iVar24 = local_480;
                do {
                  iVar22 = local_314;
                  pAVar30 = (pSVar29->m_inputAttachments).
                            super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  if ((pSVar29->m_inputAttachments).
                      super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                      ._M_impl.super__Vector_impl_data._M_finish != pAVar30) {
                    uVar48 = 0;
                    do {
                      uVar66 = pAVar30[uVar48].m_attachment;
                      TVar27 = ::vk::mapVkFormat((pRVar62->m_attachments).
                                                 super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[uVar66].
                                                 m_format);
                      iVar23 = tcu::getNumUsedChannels(TVar27.order);
                      if (0 < iVar23) {
                        p_Var49 = (_Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                   *)&local_228->m_viewportOffset;
                        uVar58 = 0;
                        do {
                          uVar41 = *(ushort *)
                                    (*(long *)&p_Var49[uVar66]._M_impl +
                                    (ulong)(targetSize->m_data[0] * iVar22 + iVar24) * 2);
                          if ((uVar41 >> (uVar58 & 0x1e) & 1) == 0) {
                            local_2e8._0_4_ = R;
                            local_2e8._4_4_ = SNORM_INT8;
                          }
                          else {
                            local_2e0.m_data[0] =
                                 (deUint8  [1])
                                 (deUint8  [1])(char)((uVar41 >> ((byte)uVar58 & 0x1f) & 2) >> 1);
                            local_2e8 = (undefined1  [8])&local_2e0;
                          }
                          std::vector<tcu::Maybe<bool>,std::allocator<tcu::Maybe<bool>>>::
                          emplace_back<tcu::Maybe<bool>>
                                    ((vector<tcu::Maybe<bool>,std::allocator<tcu::Maybe<bool>>> *)
                                     local_3c8,(Maybe<bool> *)local_2e8);
                          uVar58 = uVar58 + 2;
                          iVar23 = iVar23 + -1;
                        } while (iVar23 != 0);
                      }
                      uVar48 = uVar48 + 1;
                      pAVar30 = (local_338->m_inputAttachments).
                                super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      pRVar62 = local_490;
                    } while (uVar48 < (ulong)((long)(local_338->m_inputAttachments).
                                                                                                        
                                                  super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)pAVar30 >> 3));
                  }
                  uVar48 = uStack_3c0 - (long)local_3c8 >> 4;
                  lVar47 = 1;
                  if (local_268 <= uVar48) {
                    lVar47 = (uVar48 / local_268 + 1) - (ulong)(uVar48 % local_268 == 0);
                  }
                  pAVar30 = (local_338->m_colorAttachments).
                            super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  if ((local_338->m_colorAttachments).
                      super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                      ._M_impl.super__Vector_impl_data._M_finish == pAVar30) {
                    uVar48 = 0;
                  }
                  else {
                    local_21c = iVar24 % 2;
                    uVar48 = 0;
                    uVar59 = 0;
                    do {
                      uVar66 = pAVar30[uVar59].m_attachment;
                      local_428 = uVar48;
                      local_38 = uVar59;
                      TVar27 = ::vk::mapVkFormat((pRVar62->m_attachments).
                                                 super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[uVar66].
                                                 m_format);
                      uVar58 = tcu::getNumUsedChannels(TVar27.order);
                      local_238 = (pointer)CONCAT44(local_238._4_4_,uVar58);
                      if (0 < (int)uVar58) {
                        uVar64 = uVar66 + (int)local_328 + (int)local_428;
                        bVar19 = local_21c == (uVar64 & 1);
                        bVar65 = local_41c == ((uVar64 >> 1 & 1) != 0);
                        uVar8 = *(undefined4 *)(&DAT_00af1aa0 + (ulong)(uVar64 & 3) * 4);
                        bVar18 = bVar19 != bVar65;
                        local_498 = (pointer)CONCAT71(local_498._1_7_,bVar18);
                        local_330 = (pointer)CONCAT71(local_330._1_7_,!bVar18);
                        local_260 = (void *)CONCAT71(local_260._1_7_,bVar19 && bVar65);
                        uVar48 = (ulong)(targetSize->m_data[0] * local_314 + iVar24);
                        uVar63 = lVar47 * local_428;
                        uVar59 = 0;
                        do {
                          switch(uVar8) {
                          case 0:
                            bVar20 = bVar19 && bVar65;
                            break;
                          case 1:
                            bVar20 = bVar19 || bVar65;
                            break;
                          case 2:
                            bVar20 = !bVar18;
                            break;
                          case 3:
                            bVar20 = bVar18;
                            break;
                          default:
                            bVar20 = false;
                          }
                          local_2e0.m_data[0] = (deUint8  [1])(deUint8  [1])bVar20;
                          local_2e8 = (undefined1  [8])&local_2e0;
                          if (lVar47 != 0) {
                            uVar28 = uVar63;
                            lVar50 = lVar47;
                            do {
                              if ((TextureFormat)local_2e8 == (TextureFormat)0x0) break;
                              pcVar54 = *(char **)((long)local_3c8 +
                                                  (uVar28 % (ulong)(uStack_3c0 - (long)local_3c8 >>
                                                                   4)) * 0x10);
                              TVar27.order = R;
                              TVar27.type = SNORM_INT8;
                              if (pcVar54 != (char *)0x0) {
                                local_2e0.m_data[0] =
                                     (deUint8  [1])(deUint8  [1])(*(char *)local_2e8 == *pcVar54);
                                TVar27 = (TextureFormat)&local_2e0;
                              }
                              local_2e8._0_4_ = TVar27.order;
                              local_2e8._4_4_ = TVar27.type;
                              uVar28 = uVar28 + 1;
                              lVar50 = lVar50 + -1;
                            } while (lVar50 != 0);
                          }
                          lVar50 = *(long *)&((_Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                               *)&local_228->m_viewportOffset)[uVar66]._M_impl;
                          if ((TextureFormat)local_2e8 == (TextureFormat)0x0) {
                            bVar46 = (char)uVar59 * '\x02' & 0x1f;
                            uVar41 = ((ushort)(-2 << bVar46) | (ushort)(0xfffffffe >> 0x20 - bVar46)
                                     ) & *(ushort *)(lVar50 + uVar48 * 2);
                          }
                          else {
                            cVar6 = *(char *)local_2e8;
                            bVar46 = (char)uVar59 * '\x02';
                            uVar41 = (ushort)(1 << (bVar46 & 0x1f)) |
                                     *(ushort *)(lVar50 + uVar48 * 2);
                            *(ushort *)(lVar50 + uVar48 * 2) = uVar41;
                            if (cVar6 == '\x01') {
                              uVar41 = uVar41 | (ushort)(2 << (bVar46 & 0x1f));
                            }
                            else {
                              uVar41 = uVar41 & ~(ushort)(2 << (bVar46 & 0x1e));
                            }
                          }
                          *(ushort *)(lVar50 + uVar48 * 2) = uVar41;
                          uVar59 = uVar59 + 1;
                          uVar63 = uVar63 + lVar47;
                        } while (uVar59 != uVar58);
                      }
                      uVar48 = local_428 + (long)(int)uVar58;
                      uVar59 = local_38 + 1;
                      pAVar30 = (local_338->m_colorAttachments).
                                super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      pRVar62 = local_490;
                    } while (uVar59 < (ulong)((long)(local_338->m_colorAttachments).
                                                                                                        
                                                  super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)pAVar30 >> 3));
                  }
                  uVar66 = (local_338->m_depthStencilAttachment).m_attachment;
                  if ((ulong)uVar66 != 0xffffffff) {
                    uVar58 = (int)local_328 + uVar66;
                    if (*(uint *)(&DAT_00af1aa0 + (ulong)(uVar58 & 3) * 4) < 4) {
                      uVar42 = iVar24 % 2;
                      uVar52 = uVar58 & 1;
                      uVar64 = uVar58 >> 1 & 1;
                      switch(*(uint *)(&DAT_00af1aa0 + (ulong)(uVar58 & 3) * 4)) {
                      case 0:
                        bVar18 = uVar42 == uVar52 && uVar64 == local_41c;
                        break;
                      case 1:
                        bVar18 = uVar42 == uVar52 || local_41c == uVar64;
                        break;
                      case 2:
                        bVar18 = (uVar42 == uVar52) == (local_41c == uVar64);
                        break;
                      case 3:
                        bVar18 = (uVar42 == uVar52) != (local_41c == uVar64);
                      }
                    }
                    else {
                      bVar18 = false;
                    }
                    local_2e0.m_data[0] = (deUint8  [1])(deUint8  [1])bVar18;
                    local_2e8 = (undefined1  [8])&local_2e0;
                    if (lVar47 != 0) {
                      uVar48 = uVar48 * lVar47;
                      do {
                        if ((TextureFormat)local_2e8 == (TextureFormat)0x0) break;
                        pcVar54 = *(char **)((long)local_3c8 +
                                            (uVar48 % (ulong)(uStack_3c0 - (long)local_3c8 >> 4)) *
                                            0x10);
                        TVar31.order = R;
                        TVar31.type = SNORM_INT8;
                        if (pcVar54 != (char *)0x0) {
                          local_2e0.m_data[0] =
                               (deUint8  [1])(deUint8  [1])(*(char *)local_2e8 == *pcVar54);
                          TVar31 = (TextureFormat)&local_2e0;
                        }
                        local_2e8._0_4_ = TVar31.order;
                        local_2e8._4_4_ = TVar31.type;
                        uVar48 = uVar48 + 1;
                        lVar47 = lVar47 + -1;
                      } while (lVar47 != 0);
                    }
                    uVar48 = (ulong)(targetSize->m_data[0] * local_314 + iVar24);
                    lVar47 = *(long *)&((_Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                         *)&local_228->m_viewportOffset)[uVar66]._M_impl;
                    if ((TextureFormat)local_2e8 == (TextureFormat)0x0) {
                      uVar41 = *(ushort *)(lVar47 + uVar48 * 2) & 0xfffe;
                    }
                    else {
                      uVar51 = *(ushort *)(lVar47 + uVar48 * 2);
                      uVar41 = uVar51 | 3;
                      if (*(char *)local_2e8 == '\0') {
                        uVar41 = (uVar51 & 0xfffc) + 1;
                      }
                    }
                    *(ushort *)(lVar47 + uVar48 * 2) = uVar41;
                  }
                  if ((undefined1  [8])uStack_3c0 != local_3c8) {
                    uStack_3c0 = local_3c8;
                  }
                  iVar24 = iVar24 + 1;
                  pSVar29 = local_338;
                  iVar22 = local_314;
                } while (iVar24 != local_47c);
              }
              iVar22 = iVar22 + 1;
            } while (iVar22 != local_484);
          }
          uVar48 = (ulong)(pSVar29->m_depthStencilAttachment).m_attachment;
          if (uVar48 != 0xffffffff) {
            TVar27 = ::vk::mapVkFormat((pRVar62->m_attachments).
                                       super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar48].m_format);
            p_Var49 = &(local_3f8.
                        super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
            ;
            bVar18 = tcu::hasStencilComponent(TVar27.order);
            if (bVar18 && local_4e4 < local_484) {
              uVar66 = targetSize->m_data[0];
              uVar58 = local_4e4 * uVar66 + local_480;
              do {
                if (local_480 < local_47c) {
                  lVar47 = *(long *)&p_Var49[uVar48]._M_impl;
                  iVar22 = local_47c - local_480;
                  uVar64 = uVar58;
                  do {
                    uVar41 = *(ushort *)(lVar47 + (ulong)uVar64 * 2);
                    uVar51 = uVar41 | 0xc;
                    if (((ulong)local_328 & 1) != 0) {
                      uVar51 = uVar41 & 0xfff3 | 4;
                    }
                    *(ushort *)(lVar47 + (ulong)uVar64 * 2) = uVar51;
                    uVar64 = uVar64 + 1;
                    iVar22 = iVar22 + -1;
                  } while (iVar22 != 0);
                }
                local_4e4 = local_4e4 + 1;
                uVar58 = uVar58 + uVar66;
              } while (local_4e4 != local_484);
            }
          }
          if ((VkClearDepthStencilValue)local_3c8 != (VkClearDepthStencilValue)0x0) {
            operator_delete((void *)local_3c8,local_3b8._M_allocated_capacity - (long)local_3c8);
          }
        }
      }
      pSVar45 = (pointer)((long)&(((_Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                    *)&local_328->m_viewportOffset)->_M_impl).
                                 super__Vector_impl_data._M_start + 1);
      pSVar29 = (local_490->m_subpasses).
                super__Vector_base<vkt::(anonymous_namespace)::Subpass,_std::allocator<vkt::(anonymous_namespace)::Subpass>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar26 = (pointer)(((long)(local_490->m_subpasses).
                                 super__Vector_base<vkt::(anonymous_namespace)::Subpass,_std::allocator<vkt::(anonymous_namespace)::Subpass>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar29 >> 4) *
                         0x6db6db6db6db6db7);
      pRVar62 = local_490;
    } while (pSVar45 < pSVar26);
  }
  pAVar32 = (pRVar62->m_attachments).
            super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((pRVar62->m_attachments).
      super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
      ._M_impl.super__Vector_impl_data._M_finish != pAVar32) {
    local_510 = (pointer)local_3f8.
                         super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
    lVar47 = 0;
    local_498 = (pointer)0x800000000000003f;
    pSVar45 = (pointer)0x0;
    do {
      TVar27 = ::vk::mapVkFormat(*(VkFormat *)((long)&pAVar32->m_format + lVar47));
      bVar18 = tcu::hasStencilComponent(TVar27.order);
      bVar19 = tcu::hasDepthComponent(TVar27.order);
      pSVar26 = (pointer)((long)&(pSVar45->m_renderQuad).field_1 + 0x17);
      if (-1 < (long)pSVar45) {
        pSVar26 = pSVar45;
      }
      lVar50 = ((long)pSVar26 >> 6) * 8;
      uVar48 = (ulong)(((ulong)pSVar45 & (ulong)local_498) < 0x8000000000000001);
      if ((((ulong)((TestLog *)(local_1f8._0_8_ + lVar50))[uVar48 - 1].m_log >>
            ((ulong)pSVar45 & 0x3f) & 1) != 0) &&
         (*(int *)((long)&((local_490->m_attachments).
                           super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_storeOp + lVar47) == 1)) {
        if (bVar19 || bVar18) {
          local_3c8._0_4_ = 1.4013e-45;
        }
        else {
          local_3c8._0_4_ = 2.3694278e-38;
        }
        markUndefined((vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                       *)local_510,(BVec4 *)local_3c8,targetSize,local_3d8,local_3d0);
      }
      if ((bVar18 && ((ulong)((TestLog *)(lVar50 + local_1f8._0_8_))[uVar48 - 1].m_log &
                     1L << ((byte)pSVar45 & 0x3f)) != 0) &&
         (*(int *)((long)&((local_490->m_attachments).
                           super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_stencilStoreOp + lVar47) ==
          1)) {
        local_3c8._0_4_ = 3.58732e-43;
        markUndefined((vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                       *)local_510,(BVec4 *)local_3c8,targetSize,local_3d8,local_3d0);
      }
      pSVar45 = (pointer)((long)&(((_Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                    *)&pSVar45->m_viewportOffset)->_M_impl).super__Vector_impl_data.
                                 _M_start + 1);
      pAVar32 = (local_490->m_attachments).
                super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar26 = (pointer)((long)(local_490->m_attachments).
                                super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar32 >> 5);
      lVar47 = lVar47 + 0x20;
      local_510 = (pointer)&local_510->m_flags;
    } while (pSVar45 < pSVar26);
  }
  if ((TextureFormat)local_1f8._0_8_ != (TextureFormat)0x0) {
    operator_delete((void *)local_1f8._0_8_,(long)local_1d8 - local_1f8._0_8_);
    local_1f8._0_4_ = R;
    local_1f8._4_4_ = SNORM_INT8;
    local_1f8._8_4_ = 0;
    local_1f8._16_8_ = (_Bit_type *)0x0;
    local_1e0 = 0;
    local_1d8 = (_Bit_pointer)0x0;
  }
  std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::resize
            (&local_78,
             ((long)local_3f8.
                    super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_3f8.
                    super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  pAVar32 = (local_490->m_attachments).
            super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((local_490->m_attachments).
      super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
      ._M_impl.super__Vector_impl_data._M_finish != pAVar32) {
    local_330 = (pointer)local_3f8.
                         super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
    pSVar45 = (pointer)0x0;
    do {
      local_498 = pSVar45;
      local_2e8 = (undefined1  [8])::vk::mapVkFormat(pAVar32[(long)pSVar45].m_format);
      bVar18 = tcu::hasDepthComponent(local_2e8._0_4_);
      bVar19 = tcu::hasStencilComponent(local_2e8._0_4_);
      this_00 = local_78.super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
                _M_impl.super__Vector_impl_data._M_start + (long)local_498;
      tcu::TextureLevel::setStorage
                (this_00,(TextureFormat *)local_2e8,targetSize->m_data[0],targetSize->m_data[1],1);
      p_Var49 = (_Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                 *)&local_330->m_viewportOffset + (long)local_498;
      if (bVar18 || bVar19) {
        if (bVar18) {
          tcu::TextureLevel::getAccess((PixelBufferAccess *)local_3c8,this_00);
          tcu::getEffectiveDepthStencilAccess
                    ((PixelBufferAccess *)local_1f8,(PixelBufferAccess *)local_3c8,MODE_DEPTH);
          if (targetSize->m_data[1] != 0) {
            uVar48 = 0;
            do {
              uVar66 = targetSize->m_data[0];
              iVar22 = (int)uVar48;
              if (uVar66 != 0) {
                uVar59 = 0;
                do {
                  iVar24 = (int)uVar59;
                  uVar63 = (ulong)(uVar66 * iVar22 + iVar24);
                  uVar41 = *(ushort *)(*(long *)&p_Var49->_M_impl + uVar63 * 2);
                  if ((uVar41 & 1) == 0) {
                    puVar35 = (undefined8 *)0x0;
                  }
                  else {
                    local_3c8._0_4_ = 0.0;
                    local_3c8._4_4_ = 0;
                    uStack_3c0 = CONCAT71(uStack_3c0._1_7_,(byte)uVar41 >> 1) & 0xffffffffffffff01;
                    puVar35 = &uStack_3c0;
                  }
                  if (puVar35 == (undefined8 *)0x0) {
                    fVar67 = *(float *)(&DAT_00af1ee4 +
                                       (ulong)((((uint)(uVar59 * 0xaaaaaaab >> 0x20) ^
                                                (uint)(uVar48 * 0xaaaaaaab >> 0x20)) >> 1 & 1) == 0)
                                       * 4);
                  }
                  else {
                    fVar67 = 1.0;
                    if ((*(byte *)(*(long *)&p_Var49->_M_impl + uVar63 * 2) >> 1 & 1) == 0) {
                      fVar67 = 0.0;
                    }
                  }
                  tcu::PixelBufferAccess::setPixDepth
                            ((PixelBufferAccess *)local_1f8,fVar67,iVar24,iVar22,0);
                  uVar59 = (ulong)(iVar24 + 1U);
                  uVar66 = targetSize->m_data[0];
                } while (iVar24 + 1U < uVar66);
              }
              uVar48 = (ulong)(iVar22 + 1U);
            } while (iVar22 + 1U < targetSize->m_data[1]);
          }
        }
        if (bVar19) {
          tcu::TextureLevel::getAccess((PixelBufferAccess *)local_3c8,this_00);
          tcu::getEffectiveDepthStencilAccess
                    ((PixelBufferAccess *)local_1f8,(PixelBufferAccess *)local_3c8,MODE_STENCIL);
          if (targetSize->m_data[1] != 0) {
            uVar66 = 0;
            do {
              uVar58 = targetSize->m_data[0];
              if (uVar58 != 0) {
                uVar48 = 0;
                do {
                  iVar22 = (int)uVar48;
                  uVar59 = (ulong)(uVar58 * uVar66 + iVar22);
                  uVar41 = *(ushort *)(*(long *)&p_Var49->_M_impl + uVar59 * 2);
                  if ((uVar41 & 4) == 0) {
                    puVar35 = (undefined8 *)0x0;
                  }
                  else {
                    local_3c8._0_4_ = 0.0;
                    local_3c8._4_4_ = 0;
                    uStack_3c0 = CONCAT71(uStack_3c0._1_7_,(byte)uVar41 >> 3) & 0xffffffffffffff01;
                    puVar35 = &uStack_3c0;
                  }
                  if (puVar35 == (undefined8 *)0x0) {
                    iVar24 = 0x55;
                    if ((((uint)(uVar48 * 0xaaaaaaab >> 0x20) ^
                         (uint)((ulong)uVar66 * 0xaaaaaaab >> 0x20)) >> 1 & 1) != 0) {
                      iVar24 = 0xaa;
                    }
                  }
                  else {
                    iVar24 = 0xff;
                    if ((*(byte *)(*(long *)&p_Var49->_M_impl + uVar59 * 2) >> 3 & 1) == 0) {
                      iVar24 = 0;
                    }
                  }
                  tcu::PixelBufferAccess::setPixStencil
                            ((PixelBufferAccess *)local_1f8,iVar24,iVar22,uVar66,0);
                  uVar48 = (ulong)(iVar22 + 1U);
                  uVar58 = targetSize->m_data[0];
                } while (iVar22 + 1U < uVar58);
              }
              uVar66 = uVar66 + 1;
            } while (uVar66 < targetSize->m_data[1]);
          }
        }
      }
      else if (targetSize->m_data[1] != 0) {
        uVar66 = 0;
        do {
          uVar58 = targetSize->m_data[0];
          if (uVar58 != 0) {
            uVar64 = 0;
            do {
              uVar42 = uVar64 / 3;
              local_3c8._0_4_ = 0.0;
              local_3c8._4_4_ = 0;
              uStack_3c0._0_4_ = R;
              uStack_3c0._4_4_ = SNORM_INT8;
              uVar48 = (ulong)(uVar58 * uVar66 + uVar64);
              lVar47 = 0;
              do {
                uVar41 = *(ushort *)(*(long *)&p_Var49->_M_impl + uVar48 * 2);
                if ((uVar41 >> ((uint)lVar47 & 0x1f) & 1) == 0) {
                  puVar53 = (undefined1 *)0x0;
                }
                else {
                  local_1f8._0_4_ = R;
                  local_1f8._4_4_ = SNORM_INT8;
                  local_1f8[8] = SUB41((uVar41 >> ((byte)lVar47 & 0x1f) & 2) >> 1,0);
                  puVar53 = local_1f8 + 8;
                }
                if (puVar53 == (undefined1 *)0x0) {
                  *(undefined4 *)(local_3c8 + lVar47 * 2) =
                       *(undefined4 *)
                        (&DAT_00af1ee4 + (ulong)(((uVar42 ^ uVar66 / 3) & 1) == 0) * 4);
                }
                else if ((*(ushort *)(*(long *)&p_Var49->_M_impl + uVar48 * 2) >>
                          ((byte)lVar47 & 0x1f) & 2) == 0) {
                  *(undefined4 *)(local_3c8 + lVar47 * 2) = 0;
                }
                else {
                  *(undefined4 *)(local_3c8 + lVar47 * 2) = 0x3f800000;
                }
                lVar47 = lVar47 + 2;
                uVar42 = uVar42 + 1;
              } while (lVar47 != 8);
              tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1f8,this_00);
              tcu::PixelBufferAccess::setPixel
                        ((PixelBufferAccess *)local_1f8,(Vec4 *)local_3c8,uVar64,uVar66,0);
              uVar64 = uVar64 + 1;
              uVar58 = targetSize->m_data[0];
            } while (uVar64 < uVar58);
          }
          uVar66 = uVar66 + 1;
        } while (uVar66 < targetSize->m_data[1]);
      }
      pSVar45 = (pointer)((long)&(((_Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                    *)&local_498->m_viewportOffset)->_M_impl).
                                 super__Vector_impl_data._M_start + 1);
      pAVar32 = (local_490->m_attachments).
                super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar26 = (pointer)((long)(local_490->m_attachments).
                                super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar32 >> 5);
    } while (pSVar45 < pSVar26);
  }
  pAVar32 = (local_490->m_attachments).
            super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((local_490->m_attachments).
      super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
      ._M_impl.super__Vector_impl_data._M_finish == pAVar32) {
    bVar46 = 1;
  }
  else {
    local_428 = CONCAT44(local_428._4_4_,(int)CONCAT71((int7)((ulong)pSVar26 >> 8),1));
    uVar48 = 0;
    pvVar57 = local_270;
    pRVar62 = local_490;
    do {
      uVar59 = uVar48 + 0x3f;
      if (-1 < (long)uVar48) {
        uVar59 = uVar48;
      }
      if (((pvVar57->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar59 >> 6) +
            (ulong)((uVar48 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
           (uVar48 & 0x3f) & 1) == 0) {
        pSVar26 = (pointer)(uVar48 * 0x20);
        format_00 = pAVar32[uVar48].m_format;
        local_320 = ::vk::mapVkFormat(format_00);
        bVar18 = tcu::hasDepthComponent(local_320.order);
        if (bVar18) {
          bVar18 = tcu::hasStencilComponent(local_320.order);
          if (!bVar18) goto LAB_003cc3b7;
          local_40 = ::vk::getDepthCopyFormat(format_00);
          local_330 = (pointer)CONCAT44(local_330._4_4_,targetSize->m_data[0]);
          uVar66 = targetSize->m_data[1];
          iVar22 = tcu::TextureFormat::getPixelSize(&local_40);
          local_260 = *(void **)(*(long *)&(((local_230->
                                             super__Vector_base<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start[uVar48].
                                            m_ptr)->m_bufferMemory).
                                           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                                           .m_data + 0x18);
          local_498 = pSVar26;
          local_48 = ::vk::getStencilCopyFormat(format_00);
          uVar58 = targetSize->m_data[0];
          uVar64 = targetSize->m_data[1];
          iVar24 = tcu::TextureFormat::getPixelSize(&local_48);
          local_2c8 = (ulong)(uVar66 * (int)local_330 * iVar22);
          local_2a0 = (ulong)(uVar64 * uVar58 * iVar24);
          pSVar13 = (local_230->
                    super__Vector_base<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pvVar14 = *(void **)(*(long *)&((pSVar13[uVar48].m_ptr)->m_secondaryBufferMemory).
                                         super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                                         .m_data + 0x18);
          local_2e8._0_4_ = RA;
          local_2e0.m_align = 0;
          local_2d8 = *(undefined8 *)
                       (*(long *)&((pSVar13[uVar48].m_ptr)->m_bufferMemory).
                                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                                  .m_data + 8);
          local_2d0 = *(undefined8 *)
                       (*(long *)&((pSVar13[uVar48].m_ptr)->m_bufferMemory).
                                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                                  .m_data + 0x10);
          local_2c0 = 6;
          local_2b8 = 0;
          local_2b0 = *(undefined8 *)
                       (*(long *)&((pSVar13[uVar48].m_ptr)->m_secondaryBufferMemory).
                                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                                  .m_data + 8);
          local_2a8 = *(undefined8 *)
                       (*(long *)&((pSVar13[uVar48].m_ptr)->m_secondaryBufferMemory).
                                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                                  .m_data + 0x10);
          VVar25 = (*local_58->_vptr_DeviceInterface[10])(local_58,local_50,2,local_2e8);
          ::vk::checkResult(VVar25,"vk.invalidateMappedMemoryRanges(device, 2u, ranges)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/vktRenderPassTests.cpp"
                            ,0xd35);
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    ((ConstPixelBufferAccess *)local_310,&local_40,targetSize->m_data[0],
                     targetSize->m_data[1],1,local_260);
          pvVar57 = local_270;
          pRVar62 = local_490;
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    (&local_298,&local_48,targetSize->m_data[0],targetSize->m_data[1],1,pvVar14);
          local_1f8._0_4_ = RGBA;
          local_1f8._4_4_ = UNORM_INT8;
          pCVar40 = (ConstPixelBufferAccess *)local_1f8;
          tcu::TextureLevel::TextureLevel
                    ((TextureLevel *)local_4c0,(TextureFormat *)pCVar40,targetSize->m_data[0],
                     targetSize->m_data[1],1);
          local_1f8._0_4_ = RGBA;
          local_1f8._4_4_ = UNORM_INT8;
          tcu::TextureLevel::TextureLevel
                    ((TextureLevel *)&local_470,(TextureFormat *)pCVar40,targetSize->m_data[0],
                     targetSize->m_data[1],1);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)pCVar40);
          std::ostream::_M_insert<unsigned_long>((ulong)pCVar40);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)pCVar40);
          std::ios_base::~ios_base(local_188);
          plVar33 = (long *)std::__cxx11::string::replace((ulong)&local_448,0,(char *)0x0,0xb0754d);
          local_4e0 = &local_4d0;
          plVar37 = plVar33 + 2;
          if ((long *)*plVar33 == plVar37) {
            local_4d0 = *plVar37;
            lStack_4c8 = plVar33[3];
          }
          else {
            local_4d0 = *plVar37;
            local_4e0 = (long *)*plVar33;
          }
          local_4d8 = plVar33[1];
          *plVar33 = (long)plVar37;
          plVar33[1] = 0;
          *(undefined1 *)(plVar33 + 2) = 0;
          plVar33 = (long *)std::__cxx11::string::append((char *)&local_4e0);
          local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
          psVar38 = (size_type *)(plVar33 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar33 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar38) {
            local_508.field_2._M_allocated_capacity = *psVar38;
            local_508.field_2._8_8_ = plVar33[3];
          }
          else {
            local_508.field_2._M_allocated_capacity = *psVar38;
            local_508._M_dataplus._M_p = (pointer)*plVar33;
          }
          local_508._M_string_length = plVar33[1];
          *plVar33 = (long)psVar38;
          plVar33[1] = 0;
          *(undefined1 *)(plVar33 + 2) = 0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)pCVar40);
          std::ostream::_M_insert<unsigned_long>((ulong)pCVar40);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)pCVar40);
          std::ios_base::~ios_base(local_188);
          plVar33 = (long *)std::__cxx11::string::replace((ulong)local_218,0,(char *)0x0,0xaf24a8);
          local_258 = &local_248;
          plVar37 = plVar33 + 2;
          if ((long *)*plVar33 == plVar37) {
            local_248 = *plVar37;
            lStack_240 = plVar33[3];
          }
          else {
            local_248 = *plVar37;
            local_258 = (long *)*plVar33;
          }
          local_250 = plVar33[1];
          *plVar33 = (long)plVar37;
          plVar33[1] = 0;
          *(undefined1 *)(plVar33 + 2) = 0;
          plVar33 = (long *)std::__cxx11::string::append((char *)&local_258);
          local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
          psVar38 = (size_type *)(plVar33 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar33 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar38) {
            local_418.field_2._M_allocated_capacity = *psVar38;
            local_418.field_2._8_8_ = plVar33[3];
          }
          else {
            local_418.field_2._M_allocated_capacity = *psVar38;
            local_418._M_dataplus._M_p = (pointer)*plVar33;
          }
          local_418._M_string_length = plVar33[1];
          *plVar33 = (long)psVar38;
          plVar33[1] = 0;
          *(undefined1 *)(plVar33 + 2) = 0;
          pCVar39 = (ConstPixelBufferAccess *)local_310;
          tcu::LogImage::LogImage
                    ((LogImage *)local_3c8,&local_508,&local_418,pCVar39,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)local_3c8,(int)local_478,__buf_01,(size_t)pCVar39);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_p != local_398) {
            operator_delete(local_3a8._M_p,local_398[0]._M_allocated_capacity + 1);
          }
          if (local_3c8 != (undefined1  [8])&local_3b8) {
            operator_delete((void *)local_3c8,local_3b8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p != &local_418.field_2) {
            operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
          }
          if (local_258 != &local_248) {
            operator_delete(local_258,local_248 + 1);
          }
          if (local_218[0] != local_208) {
            operator_delete(local_218[0],local_208[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_508._M_dataplus._M_p != &local_508.field_2) {
            operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
          }
          if (local_4e0 != &local_4d0) {
            operator_delete(local_4e0,local_4d0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_448._M_dataplus._M_p != &local_448.field_2) {
            operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)pCVar40);
          std::ostream::_M_insert<unsigned_long>((ulong)pCVar40);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)pCVar40);
          std::ios_base::~ios_base(local_188);
          plVar33 = (long *)std::__cxx11::string::replace((ulong)&local_448,0,(char *)0x0,0xb0754d);
          local_4e0 = &local_4d0;
          plVar37 = plVar33 + 2;
          if ((long *)*plVar33 == plVar37) {
            local_4d0 = *plVar37;
            lStack_4c8 = plVar33[3];
          }
          else {
            local_4d0 = *plVar37;
            local_4e0 = (long *)*plVar33;
          }
          local_4d8 = plVar33[1];
          *plVar33 = (long)plVar37;
          plVar33[1] = 0;
          *(undefined1 *)(plVar33 + 2) = 0;
          plVar33 = (long *)std::__cxx11::string::append((char *)&local_4e0);
          local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
          psVar38 = (size_type *)(plVar33 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar33 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar38) {
            local_508.field_2._M_allocated_capacity = *psVar38;
            local_508.field_2._8_8_ = plVar33[3];
          }
          else {
            local_508.field_2._M_allocated_capacity = *psVar38;
            local_508._M_dataplus._M_p = (pointer)*plVar33;
          }
          local_508._M_string_length = plVar33[1];
          *plVar33 = (long)psVar38;
          plVar33[1] = 0;
          *(undefined1 *)(plVar33 + 2) = 0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)pCVar40);
          std::ostream::_M_insert<unsigned_long>((ulong)pCVar40);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)pCVar40);
          std::ios_base::~ios_base(local_188);
          plVar33 = (long *)std::__cxx11::string::replace((ulong)local_218,0,(char *)0x0,0xaf24a8);
          local_258 = &local_248;
          plVar37 = plVar33 + 2;
          if ((long *)*plVar33 == plVar37) {
            local_248 = *plVar37;
            lStack_240 = plVar33[3];
          }
          else {
            local_248 = *plVar37;
            local_258 = (long *)*plVar33;
          }
          local_250 = plVar33[1];
          *plVar33 = (long)plVar37;
          plVar33[1] = 0;
          *(undefined1 *)(plVar33 + 2) = 0;
          plVar33 = (long *)std::__cxx11::string::append((char *)&local_258);
          local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
          psVar38 = (size_type *)(plVar33 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar33 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar38) {
            local_418.field_2._M_allocated_capacity = *psVar38;
            local_418.field_2._8_8_ = plVar33[3];
          }
          else {
            local_418.field_2._M_allocated_capacity = *psVar38;
            local_418._M_dataplus._M_p = (pointer)*plVar33;
          }
          local_418._M_string_length = plVar33[1];
          *plVar33 = (long)psVar38;
          plVar33[1] = 0;
          *(undefined1 *)(plVar33 + 2) = 0;
          pCVar39 = &local_298;
          tcu::LogImage::LogImage
                    ((LogImage *)local_3c8,&local_508,&local_418,pCVar39,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)local_3c8,(int)local_478,__buf_02,(size_t)pCVar39);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_p != local_398) {
            operator_delete(local_3a8._M_p,local_398[0]._M_allocated_capacity + 1);
          }
          if (local_3c8 != (undefined1  [8])&local_3b8) {
            operator_delete((void *)local_3c8,local_3b8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p != &local_418.field_2) {
            operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
          }
          if (local_258 != &local_248) {
            operator_delete(local_258,local_248 + 1);
          }
          if (local_218[0] != local_208) {
            operator_delete(local_218[0],local_208[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_508._M_dataplus._M_p != &local_508.field_2) {
            operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
          }
          if (local_4e0 != &local_4d0) {
            operator_delete(local_4e0,local_4d0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_448._M_dataplus._M_p != &local_448.field_2) {
            operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)pCVar40);
          std::ostream::_M_insert<unsigned_long>((ulong)pCVar40);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)pCVar40);
          std::ios_base::~ios_base(local_188);
          puVar35 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_4e0,0,(char *)0x0,0xaf297e);
          local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
          psVar38 = puVar35 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar35 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar38) {
            local_508.field_2._M_allocated_capacity = *psVar38;
            local_508.field_2._8_8_ = puVar35[3];
          }
          else {
            local_508.field_2._M_allocated_capacity = *psVar38;
            local_508._M_dataplus._M_p = (pointer)*puVar35;
          }
          local_508._M_string_length = puVar35[1];
          *puVar35 = psVar38;
          puVar35[1] = 0;
          *(undefined1 *)(puVar35 + 2) = 0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)pCVar40);
          std::ostream::_M_insert<unsigned_long>((ulong)pCVar40);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)pCVar40);
          std::ios_base::~ios_base(local_188);
          plVar33 = (long *)std::__cxx11::string::replace((ulong)&local_418,0,(char *)0x0,0xaf2992);
          local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
          psVar38 = (size_type *)(plVar33 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar33 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar38) {
            local_448.field_2._M_allocated_capacity = *psVar38;
            local_448.field_2._8_8_ = plVar33[3];
          }
          else {
            local_448.field_2._M_allocated_capacity = *psVar38;
            local_448._M_dataplus._M_p = (pointer)*plVar33;
          }
          local_448._M_string_length = plVar33[1];
          *plVar33 = (long)psVar38;
          plVar33[1] = 0;
          *(undefined1 *)(plVar33 + 2) = 0;
          tcu::TextureLevel::getAccess
                    ((PixelBufferAccess *)pCVar40,
                     local_78.
                     super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar48);
          pCVar39 = pCVar40;
          tcu::LogImage::LogImage
                    ((LogImage *)local_3c8,&local_508,&local_448,pCVar40,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)local_3c8,(int)local_478,__buf_03,(size_t)pCVar39);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_p != local_398) {
            operator_delete(local_3a8._M_p,local_398[0]._M_allocated_capacity + 1);
          }
          if (local_3c8 != (undefined1  [8])&local_3b8) {
            operator_delete((void *)local_3c8,local_3b8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_448._M_dataplus._M_p != &local_448.field_2) {
            operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p != &local_418.field_2) {
            operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_508._M_dataplus._M_p != &local_508.field_2) {
            operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
          }
          if (local_4e0 != &local_4d0) {
            operator_delete(local_4e0,local_4d0 + 1);
          }
          pvVar16 = local_3f8.
                    super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (*(int *)((long)&(((_Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                 *)&local_498->m_viewportOffset)->_M_impl).super__Vector_impl_data.
                              _M_finish +
                      (long)&((pRVar62->m_attachments).
                              super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_samples) == 0) {
            tcu::TextureLevel::getAccess((PixelBufferAccess *)pCVar40,(TextureLevel *)local_4c0);
            bVar18 = verifyDepthAttachment
                               ((vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                 *)(&pvVar16->
                                     super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                   + uVar48),(ConstPixelBufferAccess *)local_310,
                                (PixelBufferAccess *)pCVar40);
            if (!bVar18) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)pCVar40);
              std::ostream::_M_insert<unsigned_long>((ulong)pCVar40);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)pCVar40);
              std::ios_base::~ios_base(local_188);
              puVar35 = (undefined8 *)
                        std::__cxx11::string::replace((ulong)&local_4e0,0,(char *)0x0,0xaf29a8);
              local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
              psVar38 = puVar35 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar35 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar38) {
                local_508.field_2._M_allocated_capacity = *psVar38;
                local_508.field_2._8_8_ = puVar35[3];
              }
              else {
                local_508.field_2._M_allocated_capacity = *psVar38;
                local_508._M_dataplus._M_p = (pointer)*puVar35;
              }
              local_508._M_string_length = puVar35[1];
              *puVar35 = psVar38;
              puVar35[1] = 0;
              *(undefined1 *)(puVar35 + 2) = 0;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)pCVar40);
              std::ostream::_M_insert<unsigned_long>((ulong)pCVar40);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)pCVar40);
              std::ios_base::~ios_base(local_188);
              plVar33 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_418,0,(char *)0x0,0xaf29bd);
              local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
              psVar38 = (size_type *)(plVar33 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar33 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar38) {
                local_448.field_2._M_allocated_capacity = *psVar38;
                local_448.field_2._8_8_ = plVar33[3];
              }
              else {
                local_448.field_2._M_allocated_capacity = *psVar38;
                local_448._M_dataplus._M_p = (pointer)*plVar33;
              }
              local_448._M_string_length = plVar33[1];
              *plVar33 = (long)psVar38;
              plVar33[1] = 0;
              *(undefined1 *)(plVar33 + 2) = 0;
              tcu::TextureLevel::getAccess((PixelBufferAccess *)pCVar40,(TextureLevel *)local_4c0);
              pCVar39 = pCVar40;
              tcu::LogImage::LogImage
                        ((LogImage *)local_3c8,&local_508,&local_448,pCVar40,
                         QP_IMAGE_COMPRESSION_MODE_BEST);
              tcu::LogImage::write((LogImage *)local_3c8,(int)local_478,__buf_10,(size_t)pCVar39);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a8._M_p != local_398) {
                operator_delete(local_3a8._M_p,local_398[0]._M_allocated_capacity + 1);
              }
              if (local_3c8 != (undefined1  [8])&local_3b8) {
                operator_delete((void *)local_3c8,local_3b8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_448._M_dataplus._M_p != &local_448.field_2) {
                operator_delete(local_448._M_dataplus._M_p,
                                local_448.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_418._M_dataplus._M_p != &local_418.field_2) {
                operator_delete(local_418._M_dataplus._M_p,
                                local_418.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_508._M_dataplus._M_p != &local_508.field_2) {
                operator_delete(local_508._M_dataplus._M_p,
                                local_508.field_2._M_allocated_capacity + 1);
              }
              if (local_4e0 != &local_4d0) {
                operator_delete(local_4e0,local_4d0 + 1);
              }
              local_428 = local_428 & 0xffffffff00000000;
            }
          }
          pvVar16 = local_3f8.
                    super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (*(int *)((long)&(((_Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                 *)&local_498->m_viewportOffset)->_M_impl).super__Vector_impl_data.
                              _M_end_of_storage +
                      (long)&((pRVar62->m_attachments).
                              super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_samples) == 0) {
            tcu::TextureLevel::getAccess((PixelBufferAccess *)pCVar40,(TextureLevel *)&local_470);
            bVar18 = verifyStencilAttachment
                               ((vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                 *)(&pvVar16->
                                     super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                   + uVar48),&local_298,(PixelBufferAccess *)pCVar40);
            if (!bVar18) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)pCVar40);
              std::ostream::_M_insert<unsigned_long>((ulong)pCVar40);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)pCVar40);
              std::ios_base::~ios_base(local_188);
              puVar35 = (undefined8 *)
                        std::__cxx11::string::replace((ulong)&local_4e0,0,(char *)0x0,0xaf29d5);
              local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
              psVar38 = puVar35 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar35 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar38) {
                local_508.field_2._M_allocated_capacity = *psVar38;
                local_508.field_2._8_8_ = puVar35[3];
              }
              else {
                local_508.field_2._M_allocated_capacity = *psVar38;
                local_508._M_dataplus._M_p = (pointer)*puVar35;
              }
              local_508._M_string_length = puVar35[1];
              *puVar35 = psVar38;
              puVar35[1] = 0;
              *(undefined1 *)(puVar35 + 2) = 0;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)pCVar40);
              std::ostream::_M_insert<unsigned_long>((ulong)pCVar40);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)pCVar40);
              std::ios_base::~ios_base(local_188);
              plVar33 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_418,0,(char *)0x0,0xaf29ec);
              local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
              psVar38 = (size_type *)(plVar33 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar33 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar38) {
                local_448.field_2._M_allocated_capacity = *psVar38;
                local_448.field_2._8_8_ = plVar33[3];
              }
              else {
                local_448.field_2._M_allocated_capacity = *psVar38;
                local_448._M_dataplus._M_p = (pointer)*plVar33;
              }
              local_448._M_string_length = plVar33[1];
              *plVar33 = (long)psVar38;
              plVar33[1] = 0;
              *(undefined1 *)(plVar33 + 2) = 0;
              tcu::TextureLevel::getAccess((PixelBufferAccess *)pCVar40,(TextureLevel *)&local_470);
              tcu::LogImage::LogImage
                        ((LogImage *)local_3c8,&local_508,&local_448,pCVar40,
                         QP_IMAGE_COMPRESSION_MODE_BEST);
              tcu::LogImage::write((LogImage *)local_3c8,(int)local_478,__buf_11,(size_t)pCVar40);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a8._M_p != local_398) {
                operator_delete(local_3a8._M_p,local_398[0]._M_allocated_capacity + 1);
              }
              if (local_3c8 != (undefined1  [8])&local_3b8) {
                operator_delete((void *)local_3c8,local_3b8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_448._M_dataplus._M_p != &local_448.field_2) {
                operator_delete(local_448._M_dataplus._M_p,
                                local_448.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_418._M_dataplus._M_p != &local_418.field_2) {
                operator_delete(local_418._M_dataplus._M_p,
                                local_418.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_508._M_dataplus._M_p != &local_508.field_2) {
                operator_delete(local_508._M_dataplus._M_p,
                                local_508.field_2._M_allocated_capacity + 1);
              }
              if (local_4e0 != &local_4d0) {
                operator_delete(local_4e0,local_4d0 + 1);
              }
              local_428 = local_428 & 0xffffffff00000000;
            }
          }
          tcu::TextureLevel::~TextureLevel((TextureLevel *)&local_470);
          pCVar40 = (ConstPixelBufferAccess *)local_4c0;
        }
        else {
LAB_003cc3b7:
          uVar66 = targetSize->m_data[0];
          uVar58 = targetSize->m_data[1];
          iVar22 = tcu::TextureFormat::getPixelSize(&local_320);
          local_2c8 = (ulong)(uVar58 * uVar66 * iVar22);
          pSVar13 = (local_230->
                    super__Vector_base<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pvVar14 = *(void **)(*(long *)&((pSVar13[uVar48].m_ptr)->m_bufferMemory).
                                         super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                                         .m_data + 0x18);
          local_2e8._0_4_ = RA;
          local_2e0.m_align = 0;
          local_2d8 = *(undefined8 *)
                       (*(long *)&((pSVar13[uVar48].m_ptr)->m_bufferMemory).
                                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                                  .m_data + 8);
          local_2d0 = *(undefined8 *)
                       (*(long *)&((pSVar13[uVar48].m_ptr)->m_bufferMemory).
                                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                                  .m_data + 0x10);
          VVar25 = (*local_58->_vptr_DeviceInterface[10])(local_58,local_50,1,local_2e8);
          ::vk::checkResult(VVar25,"vk.invalidateMappedMemoryRanges(device, 1u, &range)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/vktRenderPassTests.cpp"
                            ,0xd5e);
          bVar18 = tcu::hasDepthComponent(local_320.order);
          if (bVar18) {
            tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                      ((ConstPixelBufferAccess *)local_310,&local_320,targetSize->m_data[0],
                       targetSize->m_data[1],1,pvVar14);
            local_1f8._0_4_ = RGBA;
            local_1f8._4_4_ = UNORM_INT8;
            pCVar40 = (ConstPixelBufferAccess *)local_1f8;
            tcu::TextureLevel::TextureLevel
                      ((TextureLevel *)&local_298,(TextureFormat *)pCVar40,targetSize->m_data[0],
                       targetSize->m_data[1],1);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)pCVar40);
            std::ostream::_M_insert<unsigned_long>((ulong)pCVar40);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)pCVar40);
            std::ios_base::~ios_base(local_188);
            pTVar34 = (TextureFormat *)
                      std::__cxx11::string::replace((ulong)&local_470,0,(char *)0x0,0xb0754d);
            local_4c0 = (undefined1  [8])&local_4b0;
            TVar27 = (TextureFormat)(pTVar34 + 2);
            if (*pTVar34 == TVar27) {
              local_4b0._M_allocated_capacity = *(undefined8 *)TVar27;
              local_4b0._8_8_ = pTVar34[3];
            }
            else {
              local_4b0._M_allocated_capacity = *(undefined8 *)TVar27;
              local_4c0 = (undefined1  [8])*pTVar34;
            }
            TStack_4b8 = pTVar34[1];
            *pTVar34 = TVar27;
            pTVar34[1].order = R;
            pTVar34[1].type = SNORM_INT8;
            *(undefined1 *)&pTVar34[2].order = R;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)pCVar40);
            std::ostream::_M_insert<unsigned_long>((ulong)pCVar40);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)pCVar40);
            std::ios_base::~ios_base(local_188);
            plVar33 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_4e0,0,(char *)0x0,0xaf24a8);
            local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
            psVar38 = (size_type *)(plVar33 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar33 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar38) {
              local_508.field_2._M_allocated_capacity = *psVar38;
              local_508.field_2._8_8_ = plVar33[3];
            }
            else {
              local_508.field_2._M_allocated_capacity = *psVar38;
              local_508._M_dataplus._M_p = (pointer)*plVar33;
            }
            local_508._M_string_length = plVar33[1];
            *plVar33 = (long)psVar38;
            plVar33[1] = 0;
            *(undefined1 *)(plVar33 + 2) = 0;
            pCVar39 = (ConstPixelBufferAccess *)local_310;
            tcu::LogImage::LogImage
                      ((LogImage *)local_3c8,(string *)local_4c0,&local_508,pCVar39,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
            tcu::LogImage::write((LogImage *)local_3c8,(int)local_478,__buf,(size_t)pCVar39);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_p != local_398) {
              operator_delete(local_3a8._M_p,local_398[0]._M_allocated_capacity + 1);
            }
            if (local_3c8 != (undefined1  [8])&local_3b8) {
              operator_delete((void *)local_3c8,local_3b8._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_508._M_dataplus._M_p != &local_508.field_2) {
              operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_4e0 != &local_4d0) {
              operator_delete(local_4e0,local_4d0 + 1);
            }
            if (local_4c0 != (undefined1  [8])&local_4b0) {
              operator_delete((void *)local_4c0,local_4b0._M_allocated_capacity + 1);
            }
            if ((int *)CONCAT62(local_470.m_format._2_6_,(undefined2)local_470.m_format.order) !=
                local_470.m_size.m_data + 2) {
              operator_delete((undefined1 *)
                              CONCAT62(local_470.m_format._2_6_,(undefined2)local_470.m_format.order
                                      ),local_470._16_8_ + 1);
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)pCVar40);
            std::ostream::_M_insert<unsigned_long>((ulong)pCVar40);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)pCVar40);
            std::ios_base::~ios_base(local_188);
            pTVar34 = (TextureFormat *)
                      std::__cxx11::string::replace((ulong)&local_470,0,(char *)0x0,0xaf297e);
            local_4c0 = (undefined1  [8])&local_4b0;
            TVar27 = (TextureFormat)(pTVar34 + 2);
            if (*pTVar34 == TVar27) {
              local_4b0._M_allocated_capacity = *(undefined8 *)TVar27;
              local_4b0._8_8_ = pTVar34[3];
            }
            else {
              local_4b0._M_allocated_capacity = *(undefined8 *)TVar27;
              local_4c0 = (undefined1  [8])*pTVar34;
            }
            TStack_4b8 = pTVar34[1];
            *pTVar34 = TVar27;
            pTVar34[1].order = R;
            pTVar34[1].type = SNORM_INT8;
            *(undefined1 *)&pTVar34[2].order = R;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)pCVar40);
            std::ostream::_M_insert<unsigned_long>((ulong)pCVar40);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)pCVar40);
            std::ios_base::~ios_base(local_188);
            puVar35 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_4e0,0,(char *)0x0,0xaf2992);
            local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
            psVar38 = puVar35 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar35 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar38) {
              local_508.field_2._M_allocated_capacity = *psVar38;
              local_508.field_2._8_8_ = puVar35[3];
            }
            else {
              local_508.field_2._M_allocated_capacity = *psVar38;
              local_508._M_dataplus._M_p = (pointer)*puVar35;
            }
            local_508._M_string_length = puVar35[1];
            *puVar35 = psVar38;
            puVar35[1] = 0;
            *(undefined1 *)(puVar35 + 2) = 0;
            tcu::TextureLevel::getAccess
                      ((PixelBufferAccess *)pCVar40,
                       local_78.
                       super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
                       _M_impl.super__Vector_impl_data._M_start + uVar48);
            pCVar39 = pCVar40;
            tcu::LogImage::LogImage
                      ((LogImage *)local_3c8,(string *)local_4c0,&local_508,pCVar40,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
            tcu::LogImage::write((LogImage *)local_3c8,(int)local_478,__buf_00,(size_t)pCVar39);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_p != local_398) {
              operator_delete(local_3a8._M_p,local_398[0]._M_allocated_capacity + 1);
            }
            if (local_3c8 != (undefined1  [8])&local_3b8) {
              operator_delete((void *)local_3c8,local_3b8._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_508._M_dataplus._M_p != &local_508.field_2) {
              operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_4e0 != &local_4d0) {
              operator_delete(local_4e0,local_4d0 + 1);
            }
            if (local_4c0 != (undefined1  [8])&local_4b0) {
              operator_delete((void *)local_4c0,local_4b0._M_allocated_capacity + 1);
            }
            if ((int *)CONCAT62(local_470.m_format._2_6_,(undefined2)local_470.m_format.order) !=
                local_470.m_size.m_data + 2) {
              operator_delete((undefined1 *)
                              CONCAT62(local_470.m_format._2_6_,(undefined2)local_470.m_format.order
                                      ),local_470._16_8_ + 1);
            }
            pvVar16 = local_3f8.
                      super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pAVar32 = (pRVar62->m_attachments).
                      super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((*(int *)((long)&(((_Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                    *)&pSVar26->m_viewportOffset)->_M_impl).super__Vector_impl_data.
                                 _M_finish + (long)&pAVar32->m_samples) == 0) ||
               (*(int *)((long)&(((_Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                   *)&pSVar26->m_viewportOffset)->_M_impl).super__Vector_impl_data.
                                _M_end_of_storage + (long)&pAVar32->m_samples) == 0)) {
              tcu::TextureLevel::getAccess((PixelBufferAccess *)pCVar40,(TextureLevel *)&local_298);
              bVar18 = verifyDepthAttachment
                                 ((vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                   *)(&pvVar16->
                                       super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                     + uVar48),(ConstPixelBufferAccess *)local_310,
                                  (PixelBufferAccess *)pCVar40);
              if (!bVar18) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)pCVar40);
                std::ostream::_M_insert<unsigned_long>((ulong)pCVar40);
                std::__cxx11::stringbuf::str();
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)pCVar40);
                std::ios_base::~ios_base(local_188);
                pTVar34 = (TextureFormat *)
                          std::__cxx11::string::replace((ulong)&local_470,0,(char *)0x0,0xaf29ad);
                local_4c0 = (undefined1  [8])&local_4b0;
                TVar27 = (TextureFormat)(pTVar34 + 2);
                if (*pTVar34 == TVar27) {
                  local_4b0._M_allocated_capacity = *(undefined8 *)TVar27;
                  local_4b0._8_8_ = pTVar34[3];
                }
                else {
                  local_4b0._M_allocated_capacity = *(undefined8 *)TVar27;
                  local_4c0 = (undefined1  [8])*pTVar34;
                }
                TStack_4b8 = pTVar34[1];
                *pTVar34 = TVar27;
                pTVar34[1].order = R;
                pTVar34[1].type = SNORM_INT8;
                *(undefined1 *)&pTVar34[2].order = R;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)pCVar40);
                std::ostream::_M_insert<unsigned_long>((ulong)pCVar40);
                std::__cxx11::stringbuf::str();
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)pCVar40);
                std::ios_base::~ios_base(local_188);
                puVar35 = (undefined8 *)
                          std::__cxx11::string::replace((ulong)&local_4e0,0,(char *)0x0,0xaf29c3);
                local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
                psVar38 = puVar35 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar35 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar38) {
                  local_508.field_2._M_allocated_capacity = *psVar38;
                  local_508.field_2._8_8_ = puVar35[3];
                }
                else {
                  local_508.field_2._M_allocated_capacity = *psVar38;
                  local_508._M_dataplus._M_p = (pointer)*puVar35;
                }
                local_508._M_string_length = puVar35[1];
                *puVar35 = psVar38;
                puVar35[1] = 0;
                *(undefined1 *)(puVar35 + 2) = 0;
                tcu::TextureLevel::getAccess
                          ((PixelBufferAccess *)pCVar40,(TextureLevel *)&local_298);
                tcu::LogImage::LogImage
                          ((LogImage *)local_3c8,(string *)local_4c0,&local_508,pCVar40,
                           QP_IMAGE_COMPRESSION_MODE_BEST);
                tcu::LogImage::write((LogImage *)local_3c8,(int)local_478,__buf_08,(size_t)pCVar40);
LAB_003ce9d0:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3a8._M_p != local_398) {
                  operator_delete(local_3a8._M_p,local_398[0]._M_allocated_capacity + 1);
                }
                if (local_3c8 != (undefined1  [8])&local_3b8) {
                  operator_delete((void *)local_3c8,local_3b8._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_508._M_dataplus._M_p != &local_508.field_2) {
                  operator_delete(local_508._M_dataplus._M_p,
                                  local_508.field_2._M_allocated_capacity + 1);
                }
                if (local_4e0 != &local_4d0) {
                  operator_delete(local_4e0,local_4d0 + 1);
                }
                if (local_4c0 != (undefined1  [8])&local_4b0) {
                  operator_delete((void *)local_4c0,local_4b0._M_allocated_capacity + 1);
                }
                if ((int *)CONCAT62(local_470.m_format._2_6_,(undefined2)local_470.m_format.order)
                    != local_470.m_size.m_data + 2) {
                  operator_delete((undefined1 *)
                                  CONCAT62(local_470.m_format._2_6_,
                                           (undefined2)local_470.m_format.order),
                                  local_470._16_8_ + 1);
                }
                local_428 = local_428 & 0xffffffff00000000;
              }
            }
          }
          else {
            bVar18 = tcu::hasStencilComponent(local_320.order);
            if (bVar18) {
              tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                        ((ConstPixelBufferAccess *)local_310,&local_320,targetSize->m_data[0],
                         targetSize->m_data[1],1,pvVar14);
              local_1f8._0_4_ = RGBA;
              local_1f8._4_4_ = UNORM_INT8;
              pCVar40 = (ConstPixelBufferAccess *)local_1f8;
              tcu::TextureLevel::TextureLevel
                        ((TextureLevel *)&local_298,(TextureFormat *)pCVar40,targetSize->m_data[0],
                         targetSize->m_data[1],1);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)pCVar40);
              std::ostream::_M_insert<unsigned_long>((ulong)pCVar40);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)pCVar40);
              std::ios_base::~ios_base(local_188);
              pTVar34 = (TextureFormat *)
                        std::__cxx11::string::replace((ulong)&local_470,0,(char *)0x0,0xb0754d);
              local_4c0 = (undefined1  [8])&local_4b0;
              TVar27 = (TextureFormat)(pTVar34 + 2);
              if (*pTVar34 == TVar27) {
                local_4b0._M_allocated_capacity = *(undefined8 *)TVar27;
                local_4b0._8_8_ = pTVar34[3];
              }
              else {
                local_4b0._M_allocated_capacity = *(undefined8 *)TVar27;
                local_4c0 = (undefined1  [8])*pTVar34;
              }
              TStack_4b8 = pTVar34[1];
              *pTVar34 = TVar27;
              pTVar34[1].order = R;
              pTVar34[1].type = SNORM_INT8;
              *(undefined1 *)&pTVar34[2].order = R;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)pCVar40);
              std::ostream::_M_insert<unsigned_long>((ulong)pCVar40);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)pCVar40);
              std::ios_base::~ios_base(local_188);
              plVar33 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_4e0,0,(char *)0x0,0xaf24a8);
              local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
              psVar38 = (size_type *)(plVar33 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar33 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar38) {
                local_508.field_2._M_allocated_capacity = *psVar38;
                local_508.field_2._8_8_ = plVar33[3];
              }
              else {
                local_508.field_2._M_allocated_capacity = *psVar38;
                local_508._M_dataplus._M_p = (pointer)*plVar33;
              }
              local_508._M_string_length = plVar33[1];
              *plVar33 = (long)psVar38;
              plVar33[1] = 0;
              *(undefined1 *)(plVar33 + 2) = 0;
              pCVar39 = (ConstPixelBufferAccess *)local_310;
              tcu::LogImage::LogImage
                        ((LogImage *)local_3c8,(string *)local_4c0,&local_508,pCVar39,
                         QP_IMAGE_COMPRESSION_MODE_BEST);
              tcu::LogImage::write((LogImage *)local_3c8,(int)local_478,__buf_04,(size_t)pCVar39);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a8._M_p != local_398) {
                operator_delete(local_3a8._M_p,local_398[0]._M_allocated_capacity + 1);
              }
              if (local_3c8 != (undefined1  [8])&local_3b8) {
                operator_delete((void *)local_3c8,local_3b8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_508._M_dataplus._M_p != &local_508.field_2) {
                operator_delete(local_508._M_dataplus._M_p,
                                local_508.field_2._M_allocated_capacity + 1);
              }
              if (local_4e0 != &local_4d0) {
                operator_delete(local_4e0,local_4d0 + 1);
              }
              if (local_4c0 != (undefined1  [8])&local_4b0) {
                operator_delete((void *)local_4c0,local_4b0._M_allocated_capacity + 1);
              }
              if ((int *)CONCAT62(local_470.m_format._2_6_,(undefined2)local_470.m_format.order) !=
                  local_470.m_size.m_data + 2) {
                operator_delete((undefined1 *)
                                CONCAT62(local_470.m_format._2_6_,
                                         (undefined2)local_470.m_format.order),local_470._16_8_ + 1)
                ;
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)pCVar40);
              std::ostream::_M_insert<unsigned_long>((ulong)pCVar40);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)pCVar40);
              std::ios_base::~ios_base(local_188);
              pTVar34 = (TextureFormat *)
                        std::__cxx11::string::replace((ulong)&local_470,0,(char *)0x0,0xaf297e);
              local_4c0 = (undefined1  [8])&local_4b0;
              TVar27 = (TextureFormat)(pTVar34 + 2);
              if (*pTVar34 == TVar27) {
                local_4b0._M_allocated_capacity = *(undefined8 *)TVar27;
                local_4b0._8_8_ = pTVar34[3];
              }
              else {
                local_4b0._M_allocated_capacity = *(undefined8 *)TVar27;
                local_4c0 = (undefined1  [8])*pTVar34;
              }
              TStack_4b8 = pTVar34[1];
              *pTVar34 = TVar27;
              pTVar34[1].order = R;
              pTVar34[1].type = SNORM_INT8;
              *(undefined1 *)&pTVar34[2].order = R;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)pCVar40);
              std::ostream::_M_insert<unsigned_long>((ulong)pCVar40);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)pCVar40);
              std::ios_base::~ios_base(local_188);
              puVar35 = (undefined8 *)
                        std::__cxx11::string::replace((ulong)&local_4e0,0,(char *)0x0,0xaf2992);
              local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
              psVar38 = puVar35 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar35 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar38) {
                local_508.field_2._M_allocated_capacity = *psVar38;
                local_508.field_2._8_8_ = puVar35[3];
              }
              else {
                local_508.field_2._M_allocated_capacity = *psVar38;
                local_508._M_dataplus._M_p = (pointer)*puVar35;
              }
              local_508._M_string_length = puVar35[1];
              *puVar35 = psVar38;
              puVar35[1] = 0;
              *(undefined1 *)(puVar35 + 2) = 0;
              tcu::TextureLevel::getAccess
                        ((PixelBufferAccess *)pCVar40,
                         local_78.
                         super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
                         _M_impl.super__Vector_impl_data._M_start + uVar48);
              pCVar39 = pCVar40;
              tcu::LogImage::LogImage
                        ((LogImage *)local_3c8,(string *)local_4c0,&local_508,pCVar40,
                         QP_IMAGE_COMPRESSION_MODE_BEST);
              tcu::LogImage::write((LogImage *)local_3c8,(int)local_478,__buf_06,(size_t)pCVar39);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a8._M_p != local_398) {
                operator_delete(local_3a8._M_p,local_398[0]._M_allocated_capacity + 1);
              }
              if (local_3c8 != (undefined1  [8])&local_3b8) {
                operator_delete((void *)local_3c8,local_3b8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_508._M_dataplus._M_p != &local_508.field_2) {
                operator_delete(local_508._M_dataplus._M_p,
                                local_508.field_2._M_allocated_capacity + 1);
              }
              if (local_4e0 != &local_4d0) {
                operator_delete(local_4e0,local_4d0 + 1);
              }
              if (local_4c0 != (undefined1  [8])&local_4b0) {
                operator_delete((void *)local_4c0,local_4b0._M_allocated_capacity + 1);
              }
              if ((int *)CONCAT62(local_470.m_format._2_6_,(undefined2)local_470.m_format.order) !=
                  local_470.m_size.m_data + 2) {
                operator_delete((undefined1 *)
                                CONCAT62(local_470.m_format._2_6_,
                                         (undefined2)local_470.m_format.order),local_470._16_8_ + 1)
                ;
              }
              pvVar16 = local_3f8.
                        super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pAVar32 = (pRVar62->m_attachments).
                        super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((*(int *)((long)&(((_Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                      *)&pSVar26->m_viewportOffset)->_M_impl).
                                   super__Vector_impl_data._M_finish + (long)&pAVar32->m_samples) ==
                   0) || (*(int *)((long)&(((_Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                             *)&pSVar26->m_viewportOffset)->_M_impl).
                                          super__Vector_impl_data._M_end_of_storage +
                                  (long)&pAVar32->m_samples) == 0)) {
                tcu::TextureLevel::getAccess
                          ((PixelBufferAccess *)pCVar40,(TextureLevel *)&local_298);
                bVar18 = verifyStencilAttachment
                                   ((vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                     *)(&pvVar16->
                                         super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                       + uVar48),(ConstPixelBufferAccess *)local_310,
                                    (PixelBufferAccess *)pCVar40);
                if (!bVar18) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)pCVar40);
                  std::ostream::_M_insert<unsigned_long>((ulong)pCVar40);
                  std::__cxx11::stringbuf::str();
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pCVar40);
                  std::ios_base::~ios_base(local_188);
                  pTVar34 = (TextureFormat *)
                            std::__cxx11::string::replace((ulong)&local_470,0,(char *)0x0,0xaf29ad);
                  local_4c0 = (undefined1  [8])&local_4b0;
                  TVar27 = (TextureFormat)(pTVar34 + 2);
                  if (*pTVar34 == TVar27) {
                    local_4b0._M_allocated_capacity = *(undefined8 *)TVar27;
                    local_4b0._8_8_ = pTVar34[3];
                  }
                  else {
                    local_4b0._M_allocated_capacity = *(undefined8 *)TVar27;
                    local_4c0 = (undefined1  [8])*pTVar34;
                  }
                  TStack_4b8 = pTVar34[1];
                  *pTVar34 = TVar27;
                  pTVar34[1].order = R;
                  pTVar34[1].type = SNORM_INT8;
                  *(undefined1 *)&pTVar34[2].order = R;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)pCVar40);
                  std::ostream::_M_insert<unsigned_long>((ulong)pCVar40);
                  std::__cxx11::stringbuf::str();
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pCVar40);
                  std::ios_base::~ios_base(local_188);
                  puVar35 = (undefined8 *)
                            std::__cxx11::string::replace((ulong)&local_4e0,0,(char *)0x0,0xaf29c3);
                  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
                  psVar38 = puVar35 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar35 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar38) {
                    local_508.field_2._M_allocated_capacity = *psVar38;
                    local_508.field_2._8_8_ = puVar35[3];
                  }
                  else {
                    local_508.field_2._M_allocated_capacity = *psVar38;
                    local_508._M_dataplus._M_p = (pointer)*puVar35;
                  }
                  local_508._M_string_length = puVar35[1];
                  *puVar35 = psVar38;
                  puVar35[1] = 0;
                  *(undefined1 *)(puVar35 + 2) = 0;
                  tcu::TextureLevel::getAccess
                            ((PixelBufferAccess *)pCVar40,(TextureLevel *)&local_298);
                  tcu::LogImage::LogImage
                            ((LogImage *)local_3c8,(string *)local_4c0,&local_508,pCVar40,
                             QP_IMAGE_COMPRESSION_MODE_BEST);
                  tcu::LogImage::write
                            ((LogImage *)local_3c8,(int)local_478,__buf_09,(size_t)pCVar40);
                  goto LAB_003ce9d0;
                }
              }
            }
            else {
              tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                        ((ConstPixelBufferAccess *)local_310,&local_320,targetSize->m_data[0],
                         targetSize->m_data[1],1,pvVar14);
              local_1f8._0_4_ = RGBA;
              local_1f8._4_4_ = UNORM_INT8;
              tcu::TextureLevel::TextureLevel
                        ((TextureLevel *)&local_298,(TextureFormat *)local_1f8,targetSize->m_data[0]
                         ,targetSize->m_data[1],1);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
              std::ostream::_M_insert<unsigned_long>((ulong)local_1f8);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
              std::ios_base::~ios_base(local_188);
              pTVar34 = (TextureFormat *)
                        std::__cxx11::string::replace((ulong)&local_470,0,(char *)0x0,0xb0754d);
              TVar27 = (TextureFormat)(pTVar34 + 2);
              if (*pTVar34 == TVar27) {
                local_4b0._M_allocated_capacity = *(undefined8 *)TVar27;
                local_4b0._8_8_ = pTVar34[3];
                local_4c0 = (undefined1  [8])&local_4b0;
              }
              else {
                local_4b0._M_allocated_capacity = *(undefined8 *)TVar27;
                local_4c0 = (undefined1  [8])*pTVar34;
              }
              TStack_4b8 = pTVar34[1];
              *pTVar34 = TVar27;
              pTVar34[1].order = R;
              pTVar34[1].type = SNORM_INT8;
              *(undefined1 *)&pTVar34[2].order = R;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
              std::ostream::_M_insert<unsigned_long>((ulong)local_1f8);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
              std::ios_base::~ios_base(local_188);
              plVar33 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_4e0,0,(char *)0x0,0xaf24a8);
              local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
              psVar38 = (size_type *)(plVar33 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar33 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar38) {
                local_508.field_2._M_allocated_capacity = *psVar38;
                local_508.field_2._8_8_ = plVar33[3];
              }
              else {
                local_508.field_2._M_allocated_capacity = *psVar38;
                local_508._M_dataplus._M_p = (pointer)*plVar33;
              }
              local_508._M_string_length = plVar33[1];
              *plVar33 = (long)psVar38;
              plVar33[1] = 0;
              *(undefined1 *)(plVar33 + 2) = 0;
              pCVar40 = (ConstPixelBufferAccess *)local_310;
              tcu::LogImage::LogImage
                        ((LogImage *)local_3c8,(string *)local_4c0,&local_508,pCVar40,
                         QP_IMAGE_COMPRESSION_MODE_BEST);
              tcu::LogImage::write((LogImage *)local_3c8,(int)local_478,__buf_05,(size_t)pCVar40);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a8._M_p != local_398) {
                operator_delete(local_3a8._M_p,local_398[0]._M_allocated_capacity + 1);
              }
              if (local_3c8 != (undefined1  [8])&local_3b8) {
                operator_delete((void *)local_3c8,local_3b8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_508._M_dataplus._M_p != &local_508.field_2) {
                operator_delete(local_508._M_dataplus._M_p,
                                local_508.field_2._M_allocated_capacity + 1);
              }
              if (local_4e0 != &local_4d0) {
                operator_delete(local_4e0,local_4d0 + 1);
              }
              if (local_4c0 != (undefined1  [8])&local_4b0) {
                operator_delete((void *)local_4c0,local_4b0._M_allocated_capacity + 1);
              }
              if ((int *)CONCAT62(local_470.m_format._2_6_,(undefined2)local_470.m_format.order) !=
                  local_470.m_size.m_data + 2) {
                operator_delete((undefined1 *)
                                CONCAT62(local_470.m_format._2_6_,
                                         (undefined2)local_470.m_format.order),local_470._16_8_ + 1)
                ;
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
              std::ostream::_M_insert<unsigned_long>((ulong)local_1f8);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
              std::ios_base::~ios_base(local_188);
              pTVar34 = (TextureFormat *)
                        std::__cxx11::string::replace((ulong)&local_470,0,(char *)0x0,0xaf297e);
              TVar27 = (TextureFormat)(pTVar34 + 2);
              if (*pTVar34 == TVar27) {
                local_4b0._M_allocated_capacity = *(undefined8 *)TVar27;
                local_4b0._8_8_ = pTVar34[3];
                local_4c0 = (undefined1  [8])&local_4b0;
              }
              else {
                local_4b0._M_allocated_capacity = *(undefined8 *)TVar27;
                local_4c0 = (undefined1  [8])*pTVar34;
              }
              TStack_4b8 = pTVar34[1];
              *pTVar34 = TVar27;
              pTVar34[1].order = R;
              pTVar34[1].type = SNORM_INT8;
              *(undefined1 *)&pTVar34[2].order = R;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
              std::ostream::_M_insert<unsigned_long>((ulong)local_1f8);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
              std::ios_base::~ios_base(local_188);
              puVar35 = (undefined8 *)
                        std::__cxx11::string::replace((ulong)&local_4e0,0,(char *)0x0,0xaf2992);
              local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
              psVar38 = puVar35 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar35 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar38) {
                local_508.field_2._M_allocated_capacity = *psVar38;
                local_508.field_2._8_8_ = puVar35[3];
              }
              else {
                local_508.field_2._M_allocated_capacity = *psVar38;
                local_508._M_dataplus._M_p = (pointer)*puVar35;
              }
              local_508._M_string_length = puVar35[1];
              *puVar35 = psVar38;
              puVar35[1] = 0;
              *(undefined1 *)(puVar35 + 2) = 0;
              pCVar40 = (ConstPixelBufferAccess *)local_1f8;
              tcu::TextureLevel::getAccess
                        ((PixelBufferAccess *)pCVar40,
                         local_78.
                         super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
                         _M_impl.super__Vector_impl_data._M_start + uVar48);
              tcu::LogImage::LogImage
                        ((LogImage *)local_3c8,(string *)local_4c0,&local_508,pCVar40,
                         QP_IMAGE_COMPRESSION_MODE_BEST);
              tcu::LogImage::write((LogImage *)local_3c8,(int)local_478,__buf_07,(size_t)pCVar40);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a8._M_p != local_398) {
                operator_delete(local_3a8._M_p,local_398[0]._M_allocated_capacity + 1);
              }
              if (local_3c8 != (undefined1  [8])&local_3b8) {
                operator_delete((void *)local_3c8,local_3b8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_508._M_dataplus._M_p != &local_508.field_2) {
                operator_delete(local_508._M_dataplus._M_p,
                                local_508.field_2._M_allocated_capacity + 1);
              }
              if (local_4e0 != &local_4d0) {
                operator_delete(local_4e0,local_4d0 + 1);
              }
              if (local_4c0 != (undefined1  [8])&local_4b0) {
                operator_delete((void *)local_4c0,local_4b0._M_allocated_capacity + 1);
              }
              if ((int *)CONCAT62(local_470.m_format._2_6_,(undefined2)local_470.m_format.order) !=
                  local_470.m_size.m_data + 2) {
                operator_delete((undefined1 *)
                                CONCAT62(local_470.m_format._2_6_,
                                         (undefined2)local_470.m_format.order),local_470._16_8_ + 1)
                ;
              }
              pAVar32 = (pRVar62->m_attachments).
                        super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((*(int *)((long)&(((_Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                      *)&pSVar26->m_viewportOffset)->_M_impl).
                                   super__Vector_impl_data._M_finish + (long)&pAVar32->m_samples) ==
                   0) || (pvVar57 = local_270,
                         *(int *)((long)&(((_Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                            *)&pSVar26->m_viewportOffset)->_M_impl).
                                         super__Vector_impl_data._M_end_of_storage +
                                 (long)&pAVar32->m_samples) == 0)) {
                p_Var49 = &(local_3f8.
                            super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                ;
                tcu::TextureLevel::getAccess
                          ((PixelBufferAccess *)local_1f8,(TextureLevel *)&local_298);
                local_3c8._0_4_ = 1.0;
                local_3c8._4_4_ = 0;
                uStack_3c0._0_4_ = R;
                uStack_3c0._4_4_ = 0x3f800000;
                local_4c0._0_4_ = R;
                local_4c0._4_4_ = 0x3f800000;
                TStack_4b8.order = R;
                TStack_4b8.type = 0x3f800000;
                pvVar57 = local_270;
                if (0 < (int)local_310._12_4_) {
                  iVar22 = 0;
                  bVar18 = true;
                  do {
                    if (0 < (int)local_310._8_4_) {
                      iVar24 = 0;
                      do {
                        tcu::ConstPixelBufferAccess::getPixel
                                  (&local_470,(int)local_310,iVar24,iVar22);
                        bVar19 = true;
                        lVar47 = 0;
                        do {
                          uVar41 = *(ushort *)
                                    (*(long *)&p_Var49[uVar48]._M_impl +
                                    (long)(local_310._8_4_ * iVar22 + iVar24) * 2);
                          if ((uVar41 >> ((uint)lVar47 & 0x1f) & 1) == 0) {
                            local_508._M_dataplus._M_p = (pointer)0x0;
                          }
                          else {
                            local_508._M_string_length =
                                 CONCAT71(local_508._M_string_length._1_7_,
                                          (char)((uVar41 >> ((byte)lVar47 & 0x1f) & 2) >> 1));
                            local_508._M_dataplus._M_p = (pointer)&local_508._M_string_length;
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_508._M_dataplus._M_p !=
                              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x0) {
                            fVar67 = *(float *)((long)local_470.m_size.m_data + lVar47 * 2 + -8);
                            if (*local_508._M_dataplus._M_p == '\x01') {
                              bVar65 = fVar67 == 1.0;
                            }
                            else {
                              bVar65 = fVar67 == 0.0;
                            }
                            if ((!bVar65) || (NAN(fVar67))) {
                              bVar19 = false;
                            }
                          }
                          lVar47 = lVar47 + 2;
                        } while (lVar47 != 8);
                        if (bVar19) {
                          tcu::PixelBufferAccess::setPixel
                                    ((PixelBufferAccess *)local_1f8,(Vec4 *)local_4c0,iVar24,iVar22,
                                     0);
                        }
                        else {
                          bVar18 = false;
                          tcu::PixelBufferAccess::setPixel
                                    ((PixelBufferAccess *)local_1f8,(Vec4 *)local_3c8,iVar24,iVar22,
                                     0);
                        }
                        iVar24 = iVar24 + 1;
                      } while (iVar24 < (int)local_310._8_4_);
                    }
                    pvVar57 = local_270;
                    iVar22 = iVar22 + 1;
                  } while (iVar22 < (int)local_310._12_4_);
                  pCVar40 = (ConstPixelBufferAccess *)local_1f8;
                  if (!bVar18) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)pCVar40);
                    std::ostream::_M_insert<unsigned_long>((ulong)pCVar40);
                    std::__cxx11::stringbuf::str();
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pCVar40);
                    std::ios_base::~ios_base(local_188);
                    pTVar34 = (TextureFormat *)
                              std::__cxx11::string::replace
                                        ((ulong)&local_470,0,(char *)0x0,0xaf29ad);
                    local_4c0 = (undefined1  [8])&local_4b0;
                    TVar27 = (TextureFormat)(pTVar34 + 2);
                    if (*pTVar34 == TVar27) {
                      local_4b0._M_allocated_capacity = *(undefined8 *)TVar27;
                      local_4b0._8_8_ = pTVar34[3];
                    }
                    else {
                      local_4b0._M_allocated_capacity = *(undefined8 *)TVar27;
                      local_4c0 = (undefined1  [8])*pTVar34;
                    }
                    TStack_4b8 = pTVar34[1];
                    *pTVar34 = TVar27;
                    pTVar34[1].order = R;
                    pTVar34[1].type = SNORM_INT8;
                    *(undefined1 *)&pTVar34[2].order = R;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)pCVar40);
                    std::ostream::_M_insert<unsigned_long>((ulong)pCVar40);
                    std::__cxx11::stringbuf::str();
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pCVar40);
                    std::ios_base::~ios_base(local_188);
                    puVar35 = (undefined8 *)
                              std::__cxx11::string::replace
                                        ((ulong)&local_4e0,0,(char *)0x0,0xaf29c3);
                    local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
                    psVar38 = puVar35 + 2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar35 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar38) {
                      local_508.field_2._M_allocated_capacity = *psVar38;
                      local_508.field_2._8_8_ = puVar35[3];
                    }
                    else {
                      local_508.field_2._M_allocated_capacity = *psVar38;
                      local_508._M_dataplus._M_p = (pointer)*puVar35;
                    }
                    local_508._M_string_length = puVar35[1];
                    *puVar35 = psVar38;
                    puVar35[1] = 0;
                    *(undefined1 *)(puVar35 + 2) = 0;
                    tcu::TextureLevel::getAccess
                              ((PixelBufferAccess *)pCVar40,(TextureLevel *)&local_298);
                    tcu::LogImage::LogImage
                              ((LogImage *)local_3c8,(string *)local_4c0,&local_508,pCVar40,
                               QP_IMAGE_COMPRESSION_MODE_BEST);
                    tcu::LogImage::write
                              ((LogImage *)local_3c8,(int)local_478,__buf_12,(size_t)pCVar40);
                    goto LAB_003ce9d0;
                  }
                }
              }
            }
          }
          pCVar40 = &local_298;
        }
        tcu::TextureLevel::~TextureLevel((TextureLevel *)pCVar40);
      }
      uVar48 = uVar48 + 1;
      pAVar32 = (pRVar62->m_attachments).
                super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar48 < (ulong)((long)(pRVar62->m_attachments).
                                    super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar32 >> 5)
            );
    bVar46 = (byte)local_428;
  }
  std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::~vector(&local_78);
  std::
  vector<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
  ::~vector(&local_3f8);
  return (bool)(bVar46 & 1);
}

Assistant:

bool logAndVerifyImages (TestLog&											log,
						 const DeviceInterface&								vk,
						 VkDevice											device,
						 const vector<de::SharedPtr<AttachmentResources> >&	attachmentResources,
						 const vector<bool>&								attachmentIsLazy,
						 const RenderPass&									renderPassInfo,
						 const vector<Maybe<VkClearValue> >&				renderPassClearValues,
						 const vector<Maybe<VkClearValue> >&				imageClearValues,
						 const vector<SubpassRenderInfo>&					subpassRenderInfo,
						 const UVec2&										targetSize,
						 const TestConfig&									config)
{
	vector<vector<PixelValue> >	referenceValues;
	vector<tcu::TextureLevel>	referenceAttachments;
	bool						isOk					= true;

	log << TestLog::Message << "Reference images fill undefined pixels with 3x3 grid pattern." << TestLog::EndMessage;

	renderReferenceValues(referenceValues, renderPassInfo, targetSize, imageClearValues, renderPassClearValues, subpassRenderInfo, config.renderPos, config.renderSize);
	renderReferenceImagesFromValues(referenceAttachments, referenceValues, targetSize, renderPassInfo);

	for (size_t attachmentNdx = 0; attachmentNdx < renderPassInfo.getAttachments().size(); attachmentNdx++)
	{
		if (!attachmentIsLazy[attachmentNdx])
		{
			const Attachment			attachment		= renderPassInfo.getAttachments()[attachmentNdx];
			const tcu::TextureFormat	format			= mapVkFormat(attachment.getFormat());

			if (tcu::hasDepthComponent(format.order) && tcu::hasStencilComponent(format.order))
			{
				const tcu::TextureFormat	depthFormat			= getDepthCopyFormat(attachment.getFormat());
				const VkDeviceSize			depthBufferSize		= targetSize.x() * targetSize.y() * depthFormat.getPixelSize();
				void* const					depthPtr			= attachmentResources[attachmentNdx]->getResultMemory().getHostPtr();

				const tcu::TextureFormat	stencilFormat		= getStencilCopyFormat(attachment.getFormat());
				const VkDeviceSize			stencilBufferSize	= targetSize.x() * targetSize.y() * stencilFormat.getPixelSize();
				void* const					stencilPtr			= attachmentResources[attachmentNdx]->getSecondaryResultMemory().getHostPtr();

				const VkMappedMemoryRange	ranges[]			=
				{
					{
						VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE,								// sType;
						DE_NULL,															// pNext;
						attachmentResources[attachmentNdx]->getResultMemory().getMemory(),	// mem;
						attachmentResources[attachmentNdx]->getResultMemory().getOffset(),	// offset;
						depthBufferSize														// size;
					},
					{
						VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE,										// sType;
						DE_NULL,																	// pNext;
						attachmentResources[attachmentNdx]->getSecondaryResultMemory().getMemory(),	// mem;
						attachmentResources[attachmentNdx]->getSecondaryResultMemory().getOffset(),	// offset;
						stencilBufferSize															// size;
					}
				};
				VK_CHECK(vk.invalidateMappedMemoryRanges(device, 2u, ranges));

				{
					const ConstPixelBufferAccess	depthAccess			(depthFormat, targetSize.x(), targetSize.y(), 1, depthPtr);
					const ConstPixelBufferAccess	stencilAccess		(stencilFormat, targetSize.x(), targetSize.y(), 1, stencilPtr);
					tcu::TextureLevel				depthErrorImage		(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), targetSize.x(), targetSize.y());
					tcu::TextureLevel				stencilErrorImage	(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), targetSize.x(), targetSize.y());

					log << TestLog::Image("Attachment" + de::toString(attachmentNdx) + "Depth", "Attachment " + de::toString(attachmentNdx) + " Depth", depthAccess);
					log << TestLog::Image("Attachment" + de::toString(attachmentNdx) + "Stencil", "Attachment " + de::toString(attachmentNdx) + " Stencil", stencilAccess);

					log << TestLog::Image("AttachmentReference" + de::toString(attachmentNdx), "Attachment reference " + de::toString(attachmentNdx), referenceAttachments[attachmentNdx].getAccess());

					if (renderPassInfo.getAttachments()[attachmentNdx].getStoreOp() == VK_ATTACHMENT_STORE_OP_STORE
						&& !verifyDepthAttachment(referenceValues[attachmentNdx], depthAccess, depthErrorImage.getAccess()))
					{
						log << TestLog::Image("DepthAttachmentError" + de::toString(attachmentNdx), "Depth Attachment Error " + de::toString(attachmentNdx), depthErrorImage.getAccess());
						isOk = false;
					}

					if (renderPassInfo.getAttachments()[attachmentNdx].getStencilStoreOp() == VK_ATTACHMENT_STORE_OP_STORE
						&& !verifyStencilAttachment(referenceValues[attachmentNdx], stencilAccess, stencilErrorImage.getAccess()))
					{
						log << TestLog::Image("StencilAttachmentError" + de::toString(attachmentNdx), "Stencil Attachment Error " + de::toString(attachmentNdx), stencilErrorImage.getAccess());
						isOk = false;
					}
				}
			}
			else
			{
				const VkDeviceSize			bufferSize	= targetSize.x() * targetSize.y() * format.getPixelSize();
				void* const					ptr			= attachmentResources[attachmentNdx]->getResultMemory().getHostPtr();

				const VkMappedMemoryRange	range		=
				{
					VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE,								// sType;
					DE_NULL,															// pNext;
					attachmentResources[attachmentNdx]->getResultMemory().getMemory(),	// mem;
					attachmentResources[attachmentNdx]->getResultMemory().getOffset(),	// offset;
					bufferSize															// size;
				};
				VK_CHECK(vk.invalidateMappedMemoryRanges(device, 1u, &range));

				if (tcu::hasDepthComponent(format.order))
				{
					const ConstPixelBufferAccess	access		(format, targetSize.x(), targetSize.y(), 1, ptr);
					tcu::TextureLevel				errorImage	(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), targetSize.x(), targetSize.y());

					log << TestLog::Image("Attachment" + de::toString(attachmentNdx), "Attachment " + de::toString(attachmentNdx), access);
					log << TestLog::Image("AttachmentReference" + de::toString(attachmentNdx), "Attachment reference " + de::toString(attachmentNdx), referenceAttachments[attachmentNdx].getAccess());

					if ((renderPassInfo.getAttachments()[attachmentNdx].getStoreOp() == VK_ATTACHMENT_STORE_OP_STORE || renderPassInfo.getAttachments()[attachmentNdx].getStencilStoreOp() == VK_ATTACHMENT_STORE_OP_STORE)
						&& !verifyDepthAttachment(referenceValues[attachmentNdx], access, errorImage.getAccess()))
					{
						log << TestLog::Image("AttachmentError" + de::toString(attachmentNdx), "Attachment Error " + de::toString(attachmentNdx), errorImage.getAccess());
						isOk = false;
					}
				}
				else if (tcu::hasStencilComponent(format.order))
				{
					const ConstPixelBufferAccess	access		(format, targetSize.x(), targetSize.y(), 1, ptr);
					tcu::TextureLevel				errorImage	(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), targetSize.x(), targetSize.y());

					log << TestLog::Image("Attachment" + de::toString(attachmentNdx), "Attachment " + de::toString(attachmentNdx), access);
					log << TestLog::Image("AttachmentReference" + de::toString(attachmentNdx), "Attachment reference " + de::toString(attachmentNdx), referenceAttachments[attachmentNdx].getAccess());

					if ((renderPassInfo.getAttachments()[attachmentNdx].getStoreOp() == VK_ATTACHMENT_STORE_OP_STORE || renderPassInfo.getAttachments()[attachmentNdx].getStencilStoreOp() == VK_ATTACHMENT_STORE_OP_STORE)
						&& !verifyStencilAttachment(referenceValues[attachmentNdx], access, errorImage.getAccess()))
					{
						log << TestLog::Image("AttachmentError" + de::toString(attachmentNdx), "Attachment Error " + de::toString(attachmentNdx), errorImage.getAccess());
						isOk = false;
					}
				}
				else
				{
					const ConstPixelBufferAccess	access		(format, targetSize.x(), targetSize.y(), 1, ptr);
					tcu::TextureLevel				errorImage	(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), targetSize.x(), targetSize.y());

					log << TestLog::Image("Attachment" + de::toString(attachmentNdx), "Attachment " + de::toString(attachmentNdx), access);
					log << TestLog::Image("AttachmentReference" + de::toString(attachmentNdx), "Attachment reference " + de::toString(attachmentNdx), referenceAttachments[attachmentNdx].getAccess());

					if ((renderPassInfo.getAttachments()[attachmentNdx].getStoreOp() == VK_ATTACHMENT_STORE_OP_STORE || renderPassInfo.getAttachments()[attachmentNdx].getStencilStoreOp() == VK_ATTACHMENT_STORE_OP_STORE)
						&& !verifyColorAttachment(referenceValues[attachmentNdx], access, errorImage.getAccess()))
					{
						log << TestLog::Image("AttachmentError" + de::toString(attachmentNdx), "Attachment Error " + de::toString(attachmentNdx), errorImage.getAccess());
						isOk = false;
					}
				}
			}
		}
	}

	return isOk;
}